

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  int iVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ulong uVar79;
  byte bVar80;
  long lVar81;
  ulong uVar82;
  Geometry *pGVar83;
  uint uVar84;
  ulong uVar85;
  Geometry *geometry;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  long lVar86;
  bool bVar87;
  float fVar88;
  float fVar89;
  float fVar134;
  float fVar135;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar93 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar94 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined4 uVar142;
  undefined8 uVar143;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [64];
  float fVar153;
  float fVar154;
  float fVar162;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 in_ZMM4 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_649;
  int local_644;
  Ray *local_640;
  RayQueryContext *local_638;
  undefined1 local_630 [16];
  Precalculations *local_618;
  ulong local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  RTCFilterFunctionNArguments local_5c0;
  undefined8 local_590;
  undefined4 local_588;
  float local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  uint local_574;
  uint local_570;
  ulong local_558;
  undefined8 local_550;
  undefined8 uStack_548;
  Geometry *local_540;
  undefined8 uStack_538;
  undefined1 local_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  undefined4 uStack_4bc;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  undefined1 auStack_3dc [8];
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar79 = (ulong)(byte)PVar14;
  fVar154 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar93 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar147 = fVar154 * (ray->dir).field_0.m128[0];
  fVar153 = fVar154 * auVar93._0_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar92);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar91);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar113 = vpmovsxbd_avx2(auVar193);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar112 = vpmovsxbd_avx2(auVar10);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar79 + 6);
  auVar111 = vpmovsxbd_avx2(auVar90);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar85 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar85 + uVar79 + 6);
  auVar99 = vpmovsxbd_avx2(auVar12);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar104 = vcvtdq2ps_avx(auVar99);
  uVar82 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar105 = vpmovsxbd_avx2(auVar13);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar185._4_4_ = fVar147;
  auVar185._0_4_ = fVar147;
  auVar185._8_4_ = fVar147;
  auVar185._12_4_ = fVar147;
  auVar185._16_4_ = fVar147;
  auVar185._20_4_ = fVar147;
  auVar185._24_4_ = fVar147;
  auVar185._28_4_ = fVar147;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar100 = ZEXT1632(CONCAT412(fVar154 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar154 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar154 * (ray->dir).field_0.m128[1],fVar147))));
  auVar96 = vpermps_avx512vl(auVar95,auVar100);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = vpermps_avx512vl(auVar97,auVar100);
  fVar147 = auVar98._0_4_;
  auVar152._0_4_ = fVar147 * auVar113._0_4_;
  fVar167 = auVar98._4_4_;
  auVar152._4_4_ = fVar167 * auVar113._4_4_;
  fVar168 = auVar98._8_4_;
  auVar152._8_4_ = fVar168 * auVar113._8_4_;
  fVar169 = auVar98._12_4_;
  auVar152._12_4_ = fVar169 * auVar113._12_4_;
  fVar162 = auVar98._16_4_;
  auVar152._16_4_ = fVar162 * auVar113._16_4_;
  fVar88 = auVar98._20_4_;
  auVar152._20_4_ = fVar88 * auVar113._20_4_;
  fVar89 = auVar98._24_4_;
  auVar152._28_36_ = in_ZMM4._28_36_;
  auVar152._24_4_ = fVar89 * auVar113._24_4_;
  auVar100._4_4_ = auVar111._4_4_ * fVar167;
  auVar100._0_4_ = auVar111._0_4_ * fVar147;
  auVar100._8_4_ = auVar111._8_4_ * fVar168;
  auVar100._12_4_ = auVar111._12_4_ * fVar169;
  auVar100._16_4_ = auVar111._16_4_ * fVar162;
  auVar100._20_4_ = auVar111._20_4_ * fVar88;
  auVar100._24_4_ = auVar111._24_4_ * fVar89;
  auVar100._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar105._4_4_ * fVar167;
  auVar99._0_4_ = auVar105._0_4_ * fVar147;
  auVar99._8_4_ = auVar105._8_4_ * fVar168;
  auVar99._12_4_ = auVar105._12_4_ * fVar169;
  auVar99._16_4_ = auVar105._16_4_ * fVar162;
  auVar99._20_4_ = auVar105._20_4_ * fVar88;
  auVar99._24_4_ = auVar105._24_4_ * fVar89;
  auVar99._28_4_ = auVar98._28_4_;
  auVar92 = vfmadd231ps_fma(auVar152._0_32_,auVar96,auVar101);
  auVar91 = vfmadd231ps_fma(auVar100,auVar96,auVar112);
  auVar193 = vfmadd231ps_fma(auVar99,auVar104,auVar96);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar185,auVar102);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar185,auVar114);
  auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar103,auVar185);
  auVar186._4_4_ = fVar153;
  auVar186._0_4_ = fVar153;
  auVar186._8_4_ = fVar153;
  auVar186._12_4_ = fVar153;
  auVar186._16_4_ = fVar153;
  auVar186._20_4_ = fVar153;
  auVar186._24_4_ = fVar153;
  auVar186._28_4_ = fVar153;
  auVar100 = ZEXT1632(CONCAT412(fVar154 * auVar93._12_4_,
                                CONCAT48(fVar154 * auVar93._8_4_,
                                         CONCAT44(fVar154 * auVar93._4_4_,fVar153))));
  auVar99 = vpermps_avx512vl(auVar95,auVar100);
  auVar100 = vpermps_avx512vl(auVar97,auVar100);
  fVar154 = auVar100._0_4_;
  fVar147 = auVar100._4_4_;
  auVar95._4_4_ = fVar147 * auVar113._4_4_;
  auVar95._0_4_ = fVar154 * auVar113._0_4_;
  fVar167 = auVar100._8_4_;
  auVar95._8_4_ = fVar167 * auVar113._8_4_;
  fVar168 = auVar100._12_4_;
  auVar95._12_4_ = fVar168 * auVar113._12_4_;
  fVar169 = auVar100._16_4_;
  auVar95._16_4_ = fVar169 * auVar113._16_4_;
  fVar162 = auVar100._20_4_;
  auVar95._20_4_ = fVar162 * auVar113._20_4_;
  fVar88 = auVar100._24_4_;
  auVar95._24_4_ = fVar88 * auVar113._24_4_;
  auVar95._28_4_ = auVar113._28_4_;
  auVar107._0_4_ = auVar111._0_4_ * fVar154;
  auVar107._4_4_ = auVar111._4_4_ * fVar147;
  auVar107._8_4_ = auVar111._8_4_ * fVar167;
  auVar107._12_4_ = auVar111._12_4_ * fVar168;
  auVar107._16_4_ = auVar111._16_4_ * fVar169;
  auVar107._20_4_ = auVar111._20_4_ * fVar162;
  auVar107._24_4_ = auVar111._24_4_ * fVar88;
  auVar107._28_4_ = 0;
  auVar111._4_4_ = auVar105._4_4_ * fVar147;
  auVar111._0_4_ = auVar105._0_4_ * fVar154;
  auVar111._8_4_ = auVar105._8_4_ * fVar167;
  auVar111._12_4_ = auVar105._12_4_ * fVar168;
  auVar111._16_4_ = auVar105._16_4_ * fVar169;
  auVar111._20_4_ = auVar105._20_4_ * fVar162;
  auVar111._24_4_ = auVar105._24_4_ * fVar88;
  auVar111._28_4_ = auVar100._28_4_;
  auVar9 = vfmadd231ps_fma(auVar95,auVar99,auVar101);
  auVar10 = vfmadd231ps_fma(auVar107,auVar99,auVar112);
  auVar90 = vfmadd231ps_fma(auVar111,auVar99,auVar104);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar186,auVar102);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar186,auVar114);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar186,auVar103);
  auVar178._8_4_ = 0x7fffffff;
  auVar178._0_8_ = 0x7fffffff7fffffff;
  auVar178._12_4_ = 0x7fffffff;
  auVar178._16_4_ = 0x7fffffff;
  auVar178._20_4_ = 0x7fffffff;
  auVar178._24_4_ = 0x7fffffff;
  auVar178._28_4_ = 0x7fffffff;
  auVar102 = vandps_avx(auVar178,ZEXT1632(auVar92));
  auVar109._8_4_ = 0x219392ef;
  auVar109._0_8_ = 0x219392ef219392ef;
  auVar109._12_4_ = 0x219392ef;
  auVar109._16_4_ = 0x219392ef;
  auVar109._20_4_ = 0x219392ef;
  auVar109._24_4_ = 0x219392ef;
  auVar109._28_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar102,auVar109,1);
  bVar87 = (bool)((byte)uVar85 & 1);
  auVar96._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._0_4_;
  bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._4_4_;
  bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._8_4_;
  bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(auVar178,ZEXT1632(auVar91));
  uVar85 = vcmpps_avx512vl(auVar102,auVar109,1);
  bVar87 = (bool)((byte)uVar85 & 1);
  auVar97._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._0_4_;
  bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._4_4_;
  bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._8_4_;
  bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(auVar178,ZEXT1632(auVar193));
  uVar85 = vcmpps_avx512vl(auVar102,auVar109,1);
  bVar87 = (bool)((byte)uVar85 & 1);
  auVar102._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar193._0_4_;
  bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar193._4_4_;
  bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar193._8_4_;
  bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar193._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar96);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = &DAT_3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar96,auVar101,auVar110);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar97);
  auVar91 = vfnmadd213ps_fma(auVar97,auVar101,auVar110);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar102);
  auVar193 = vfnmadd213ps_fma(auVar102,auVar101,auVar110);
  auVar193 = vfmadd132ps_fma(ZEXT1632(auVar193),auVar101,auVar101);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar9));
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar103._4_4_ = auVar92._4_4_ * auVar102._4_4_;
  auVar103._0_4_ = auVar92._0_4_ * auVar102._0_4_;
  auVar103._8_4_ = auVar92._8_4_ * auVar102._8_4_;
  auVar103._12_4_ = auVar92._12_4_ * auVar102._12_4_;
  auVar103._16_4_ = auVar102._16_4_ * 0.0;
  auVar103._20_4_ = auVar102._20_4_ * 0.0;
  auVar103._24_4_ = auVar102._24_4_ * 0.0;
  auVar103._28_4_ = auVar102._28_4_;
  auVar102 = vcvtdq2ps_avx(auVar101);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar9));
  auVar108._0_4_ = auVar92._0_4_ * auVar102._0_4_;
  auVar108._4_4_ = auVar92._4_4_ * auVar102._4_4_;
  auVar108._8_4_ = auVar92._8_4_ * auVar102._8_4_;
  auVar108._12_4_ = auVar92._12_4_ * auVar102._12_4_;
  auVar108._16_4_ = auVar102._16_4_ * 0.0;
  auVar108._20_4_ = auVar102._20_4_ * 0.0;
  auVar108._24_4_ = auVar102._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar14 * 0x10 + uVar79 * -2 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar10));
  auVar104._4_4_ = auVar91._4_4_ * auVar102._4_4_;
  auVar104._0_4_ = auVar91._0_4_ * auVar102._0_4_;
  auVar104._8_4_ = auVar91._8_4_ * auVar102._8_4_;
  auVar104._12_4_ = auVar91._12_4_ * auVar102._12_4_;
  auVar104._16_4_ = auVar102._16_4_ * 0.0;
  auVar104._20_4_ = auVar102._20_4_ * 0.0;
  auVar104._24_4_ = auVar102._24_4_ * 0.0;
  auVar104._28_4_ = auVar102._28_4_;
  auVar102 = vcvtdq2ps_avx(auVar101);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar10));
  auVar106._0_4_ = auVar91._0_4_ * auVar102._0_4_;
  auVar106._4_4_ = auVar91._4_4_ * auVar102._4_4_;
  auVar106._8_4_ = auVar91._8_4_ * auVar102._8_4_;
  auVar106._12_4_ = auVar91._12_4_ * auVar102._12_4_;
  auVar106._16_4_ = auVar102._16_4_ * 0.0;
  auVar106._20_4_ = auVar102._20_4_ * 0.0;
  auVar106._24_4_ = auVar102._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + uVar79 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar90));
  auVar105._4_4_ = auVar102._4_4_ * auVar193._4_4_;
  auVar105._0_4_ = auVar102._0_4_ * auVar193._0_4_;
  auVar105._8_4_ = auVar102._8_4_ * auVar193._8_4_;
  auVar105._12_4_ = auVar102._12_4_ * auVar193._12_4_;
  auVar105._16_4_ = auVar102._16_4_ * 0.0;
  auVar105._20_4_ = auVar102._20_4_ * 0.0;
  auVar105._24_4_ = auVar102._24_4_ * 0.0;
  auVar105._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar90));
  auVar98._0_4_ = auVar193._0_4_ * auVar102._0_4_;
  auVar98._4_4_ = auVar193._4_4_ * auVar102._4_4_;
  auVar98._8_4_ = auVar193._8_4_ * auVar102._8_4_;
  auVar98._12_4_ = auVar193._12_4_ * auVar102._12_4_;
  auVar98._16_4_ = auVar102._16_4_ * 0.0;
  auVar98._20_4_ = auVar102._20_4_ * 0.0;
  auVar98._24_4_ = auVar102._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar103,auVar108);
  auVar101 = vpminsd_avx2(auVar104,auVar106);
  auVar102 = vmaxps_avx(auVar102,auVar101);
  auVar101 = vpminsd_avx2(auVar105,auVar98);
  uVar142 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar113._4_4_ = uVar142;
  auVar113._0_4_ = uVar142;
  auVar113._8_4_ = uVar142;
  auVar113._12_4_ = uVar142;
  auVar113._16_4_ = uVar142;
  auVar113._20_4_ = uVar142;
  auVar113._24_4_ = uVar142;
  auVar113._28_4_ = uVar142;
  auVar101 = vmaxps_avx512vl(auVar101,auVar113);
  auVar102 = vmaxps_avx(auVar102,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar102,auVar101);
  auVar174 = ZEXT3264(local_80);
  auVar102 = vpmaxsd_avx2(auVar103,auVar108);
  auVar152 = ZEXT3264(auVar102);
  auVar101 = vpmaxsd_avx2(auVar104,auVar106);
  auVar102 = vminps_avx(auVar102,auVar101);
  auVar101 = vpmaxsd_avx2(auVar105,auVar98);
  fVar154 = ray->tfar;
  auVar114._4_4_ = fVar154;
  auVar114._0_4_ = fVar154;
  auVar114._8_4_ = fVar154;
  auVar114._12_4_ = fVar154;
  auVar114._16_4_ = fVar154;
  auVar114._20_4_ = fVar154;
  auVar114._24_4_ = fVar154;
  auVar114._28_4_ = fVar154;
  auVar101 = vminps_avx512vl(auVar101,auVar114);
  auVar102 = vminps_avx(auVar102,auVar101);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar112);
  auVar101 = vpbroadcastd_avx512vl();
  uVar24 = vpcmpgtd_avx512vl(auVar101,_DAT_0205a920);
  uVar143 = vcmpps_avx512vl(local_80,auVar102,2);
  local_649 = (byte)((byte)uVar143 & (byte)uVar24) != 0;
  if (local_649) {
    uVar85 = (ulong)(byte)((byte)uVar143 & (byte)uVar24);
    do {
      auVar101 = auVar174._0_32_;
      auVar102 = auVar152._0_32_;
      local_480 = in_ZMM21._0_32_;
      local_460 = in_ZMM20._0_32_;
      lVar25 = 0;
      for (uVar79 = uVar85; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_608 = (ulong)*(uint *)(prim + 2);
      local_558 = (ulong)*(uint *)(prim + lVar25 * 4 + 6);
      pGVar83 = (context->scene->geometries).items[local_608].ptr;
      uVar79 = (ulong)*(uint *)(*(long *)&pGVar83->field_0x58 +
                               pGVar83[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_558);
      p_Var16 = pGVar83[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar83[1].time_range.upper;
      local_630 = *(undefined1 (*) [16])(lVar25 + (long)p_Var16 * uVar79);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar79 + 1) * (long)p_Var16);
      local_510 = *(undefined8 *)*pauVar3;
      uStack_508 = *(undefined8 *)(*pauVar3 + 8);
      auVar92 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar79 + 2) * (long)p_Var16);
      local_540 = *(Geometry **)*pauVar4;
      uStack_518 = *(undefined8 *)(*pauVar4 + 8);
      auVar91 = *pauVar4;
      uVar85 = uVar85 - 1 & uVar85;
      pauVar5 = (undefined1 (*) [16])(lVar25 + (uVar79 + 3) * (long)p_Var16);
      local_4b0 = *(undefined8 *)*pauVar5;
      uStack_4a8 = *(undefined8 *)(*pauVar5 + 8);
      auVar193 = *pauVar5;
      if (uVar85 != 0) {
        uVar82 = uVar85 - 1 & uVar85;
        for (uVar79 = uVar85; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        }
        if (uVar82 != 0) {
          for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar15 = (int)pGVar83[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar6 = (ray->org).field_0;
      auVar10 = vsubps_avx(local_630,(undefined1  [16])aVar6);
      uVar142 = auVar10._0_4_;
      auVar93._4_4_ = uVar142;
      auVar93._0_4_ = uVar142;
      auVar93._8_4_ = uVar142;
      auVar93._12_4_ = uVar142;
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      aVar7 = (pre->ray_space).vx.field_0;
      aVar8 = (pre->ray_space).vy.field_0;
      fVar154 = (pre->ray_space).vz.field_0.m128[0];
      fVar147 = (pre->ray_space).vz.field_0.m128[1];
      fVar167 = (pre->ray_space).vz.field_0.m128[2];
      fVar168 = (pre->ray_space).vz.field_0.m128[3];
      auVar94._0_4_ = auVar10._0_4_ * fVar154;
      auVar94._4_4_ = auVar10._4_4_ * fVar147;
      auVar94._8_4_ = auVar10._8_4_ * fVar167;
      auVar94._12_4_ = auVar10._12_4_ * fVar168;
      auVar9 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar8,auVar9);
      auVar11 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar7,auVar93);
      auVar9 = vshufps_avx(local_630,local_630,0xff);
      auVar90 = vsubps_avx(auVar92,(undefined1  [16])aVar6);
      uVar142 = auVar90._0_4_;
      auVar155._4_4_ = uVar142;
      auVar155._0_4_ = uVar142;
      auVar155._8_4_ = uVar142;
      auVar155._12_4_ = uVar142;
      auVar10 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar180._0_4_ = auVar90._0_4_ * fVar154;
      auVar180._4_4_ = auVar90._4_4_ * fVar147;
      auVar180._8_4_ = auVar90._8_4_ * fVar167;
      auVar180._12_4_ = auVar90._12_4_ * fVar168;
      auVar10 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar8,auVar10);
      auVar12 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar7,auVar155);
      auVar92 = vshufps_avx(auVar92,auVar92,0xff);
      auVar90 = vsubps_avx(auVar91,(undefined1  [16])aVar6);
      uVar142 = auVar90._0_4_;
      auVar175._4_4_ = uVar142;
      auVar175._0_4_ = uVar142;
      auVar175._8_4_ = uVar142;
      auVar175._12_4_ = uVar142;
      auVar10 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar182._0_4_ = auVar90._0_4_ * fVar154;
      auVar182._4_4_ = auVar90._4_4_ * fVar147;
      auVar182._8_4_ = auVar90._8_4_ * fVar167;
      auVar182._12_4_ = auVar90._12_4_ * fVar168;
      auVar10 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar8,auVar10);
      auVar13 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar7,auVar175);
      auVar91 = vshufps_avx(auVar91,auVar91,0xff);
      auVar90 = vsubps_avx512vl(auVar193,(undefined1  [16])aVar6);
      uVar142 = auVar90._0_4_;
      auVar156._4_4_ = uVar142;
      auVar156._0_4_ = uVar142;
      auVar156._8_4_ = uVar142;
      auVar156._12_4_ = uVar142;
      auVar10 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar183._0_4_ = auVar90._0_4_ * fVar154;
      auVar183._4_4_ = auVar90._4_4_ * fVar147;
      auVar183._8_4_ = auVar90._8_4_ * fVar167;
      auVar183._12_4_ = auVar90._12_4_ * fVar168;
      auVar10 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar8,auVar10);
      auVar10 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar7,auVar156);
      lVar25 = (long)iVar15 * 0x44;
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      auVar90 = vshufps_avx512vl(auVar193,auVar193,0xff);
      local_420 = vbroadcastss_avx512vl(auVar11);
      auVar159._8_4_ = 1;
      auVar159._0_8_ = 0x100000001;
      auVar159._12_4_ = 1;
      auVar159._16_4_ = 1;
      auVar159._20_4_ = 1;
      auVar159._24_4_ = 1;
      auVar159._28_4_ = 1;
      local_440 = vpermps_avx512vl(auVar159,ZEXT1632(auVar11));
      uVar143 = auVar9._0_8_;
      local_a0._8_8_ = uVar143;
      local_a0._0_8_ = uVar143;
      local_a0._16_8_ = uVar143;
      local_a0._24_8_ = uVar143;
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      uVar142 = auVar12._0_4_;
      local_500._4_4_ = uVar142;
      local_500._0_4_ = uVar142;
      local_500._8_4_ = uVar142;
      local_500._12_4_ = uVar142;
      local_500._16_4_ = uVar142;
      local_500._20_4_ = uVar142;
      local_500._24_4_ = uVar142;
      local_500._28_4_ = uVar142;
      local_c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar12));
      local_e0 = vbroadcastsd_avx512vl(auVar92);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_100 = vbroadcastss_avx512vl(auVar13);
      local_120 = vpermps_avx512vl(auVar159,ZEXT1632(auVar13));
      local_140 = vbroadcastsd_avx512vl(auVar91);
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_160 = vbroadcastss_avx512vl(auVar10);
      local_180 = vpermps_avx512vl(auVar159,ZEXT1632(auVar10));
      uVar143 = auVar90._0_8_;
      register0x000012c8 = uVar143;
      local_1a0 = uVar143;
      register0x000012d0 = uVar143;
      register0x000012d8 = uVar143;
      auVar103 = vmulps_avx512vl(local_160,auVar111);
      auVar104 = vmulps_avx512vl(local_180,auVar111);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_100);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar112,local_120);
      auVar92 = vfmadd231ps_fma(auVar103,auVar114,local_500);
      auVar105 = vfmadd231ps_avx512vl(auVar104,auVar114,local_c0);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar113,local_420);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar96 = vfmadd231ps_avx512vl(auVar105,auVar113,local_440);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar100 = vmulps_avx512vl(local_160,auVar99);
      auVar97 = vmulps_avx512vl(local_180,auVar99);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_100);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_120);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_500);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,local_c0);
      auVar98 = vfmadd231ps_avx512vl(auVar100,auVar103,local_420);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_440);
      auVar106 = vsubps_avx512vl(auVar98,auVar95);
      auVar107 = vsubps_avx512vl(auVar97,auVar96);
      auVar100 = vmulps_avx512vl(auVar96,auVar106);
      auVar108 = vmulps_avx512vl(auVar95,auVar107);
      auVar100 = vsubps_avx512vl(auVar100,auVar108);
      auVar108 = vmulps_avx512vl(_local_1a0,auVar111);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_140);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_a0);
      auVar109 = vmulps_avx512vl(_local_1a0,auVar99);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_140);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,local_e0);
      auVar9 = vfmadd231ps_fma(auVar109,auVar103,local_a0);
      auVar109 = vmulps_avx512vl(auVar107,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
      auVar110 = vmaxps_avx512vl(auVar108,ZEXT1632(auVar9));
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      auVar109 = vmulps_avx512vl(auVar110,auVar109);
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      uVar143 = vcmpps_avx512vl(auVar100,auVar109,2);
      auVar92 = vblendps_avx(auVar11,local_630,8);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar92,auVar90);
      auVar92 = vblendps_avx(auVar12,*pauVar3,8);
      auVar92 = vandps_avx512vl(auVar92,auVar90);
      auVar91 = vmaxps_avx(auVar91,auVar92);
      auVar92 = vblendps_avx(auVar13,*pauVar4,8);
      auVar93 = vandps_avx512vl(auVar92,auVar90);
      auVar92 = vblendps_avx(auVar10,auVar193,8);
      auVar92 = vandps_avx512vl(auVar92,auVar90);
      auVar92 = vmaxps_avx(auVar93,auVar92);
      auVar92 = vmaxps_avx(auVar91,auVar92);
      auVar91 = vmovshdup_avx(auVar92);
      auVar91 = vmaxss_avx(auVar91,auVar92);
      auVar92 = vshufpd_avx(auVar92,auVar92,1);
      auVar92 = vmaxss_avx(auVar92,auVar91);
      auVar184._0_4_ = (float)iVar15;
      _auStack_3dc = auVar11._4_12_;
      auVar184._4_4_ = auVar184._0_4_;
      auVar184._8_4_ = auVar184._0_4_;
      auVar184._12_4_ = auVar184._0_4_;
      auVar184._16_4_ = auVar184._0_4_;
      auVar184._20_4_ = auVar184._0_4_;
      auVar184._24_4_ = auVar184._0_4_;
      auVar184._28_4_ = auVar184._0_4_;
      uVar24 = vcmpps_avx512vl(auVar184,_DAT_02020f40,0xe);
      local_310 = (byte)uVar143 & (byte)uVar24;
      local_400 = auVar92._0_4_ * 4.7683716e-07;
      auVar160._8_4_ = 2;
      auVar160._0_8_ = 0x200000002;
      auVar160._12_4_ = 2;
      auVar160._16_4_ = 2;
      auVar160._20_4_ = 2;
      auVar160._24_4_ = 2;
      auVar160._28_4_ = 2;
      local_1c0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar11));
      local_1e0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar12));
      local_200 = vpermps_avx512vl(auVar160,ZEXT1632(auVar13));
      auVar100 = vpermps_avx2(auVar160,ZEXT1632(auVar10));
      uVar84 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      auVar91 = local_180._0_16_;
      auVar92 = ZEXT416((uint)local_400);
      local_520 = local_540;
      local_3e0 = auVar184._0_4_;
      if (local_310 == 0) {
        bVar87 = false;
        auVar92 = vxorps_avx512vl(auVar91,auVar91);
        auVar194 = ZEXT1664(auVar92);
        auVar174 = ZEXT3264(auVar101);
        in_ZMM20 = ZEXT3264(local_460);
        auVar152 = ZEXT3264(auVar102);
        in_ZMM21 = ZEXT3264(local_480);
        auVar192 = ZEXT3264(local_420);
        auVar191 = ZEXT3264(local_440);
        auVar190 = ZEXT3264(local_500);
      }
      else {
        local_4a0._0_16_ = ZEXT416(uVar84);
        auVar99 = vmulps_avx512vl(auVar100,auVar99);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_200,auVar99);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_1e0,auVar105);
        auVar104 = vfmadd213ps_avx512vl(auVar103,local_1c0,auVar104);
        auVar111 = vmulps_avx512vl(auVar100,auVar111);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_200,auVar111);
        auVar105 = vfmadd213ps_avx512vl(auVar114,local_1e0,auVar112);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar113,local_1c0,auVar105);
        auVar113 = vmulps_avx512vl(local_160,auVar103);
        auVar99 = vmulps_avx512vl(local_180,auVar103);
        auVar35._4_4_ = auVar100._4_4_ * auVar103._4_4_;
        auVar35._0_4_ = auVar100._0_4_ * auVar103._0_4_;
        auVar35._8_4_ = auVar100._8_4_ * auVar103._8_4_;
        auVar35._12_4_ = auVar100._12_4_ * auVar103._12_4_;
        auVar35._16_4_ = auVar100._16_4_ * auVar103._16_4_;
        auVar35._20_4_ = auVar100._20_4_ * auVar103._20_4_;
        auVar35._24_4_ = auVar100._24_4_ * auVar103._24_4_;
        auVar35._28_4_ = auVar103._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,local_100);
        auVar103 = vfmadd231ps_avx512vl(auVar99,auVar111,local_120);
        auVar111 = vfmadd231ps_avx512vl(auVar35,local_200,auVar111);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,local_500);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_c0);
        auVar99 = vfmadd231ps_avx512vl(auVar111,local_1e0,auVar112);
        auVar109 = vfmadd231ps_avx512vl(auVar113,auVar114,local_420);
        auVar191 = ZEXT3264(local_440);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,local_440);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar99 = vfmadd231ps_avx512vl(auVar99,local_1c0,auVar114);
        auVar114 = vmulps_avx512vl(local_160,auVar111);
        auVar110 = vmulps_avx512vl(local_180,auVar111);
        auVar36._4_4_ = auVar100._4_4_ * auVar111._4_4_;
        auVar36._0_4_ = auVar100._0_4_ * auVar111._0_4_;
        auVar36._8_4_ = auVar100._8_4_ * auVar111._8_4_;
        auVar36._12_4_ = auVar100._12_4_ * auVar111._12_4_;
        auVar36._16_4_ = auVar100._16_4_ * auVar111._16_4_;
        auVar36._20_4_ = auVar100._20_4_ * auVar111._20_4_;
        auVar36._24_4_ = auVar100._24_4_ * auVar111._24_4_;
        auVar36._28_4_ = auVar111._28_4_;
        auVar111 = vfmadd231ps_avx512vl(auVar114,auVar112,local_100);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,local_120);
        auVar112 = vfmadd231ps_avx512vl(auVar36,local_200,auVar112);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_500);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_c0);
        auVar114 = vfmadd231ps_avx512vl(auVar112,local_1e0,auVar114);
        auVar112 = vfmadd231ps_avx512vl(auVar111,auVar113,local_420);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar113,local_440);
        auVar110 = vfmadd231ps_avx512vl(auVar114,local_1c0,auVar113);
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar113 = vandps_avx(auVar109,auVar188);
        auVar114 = vandps_avx(auVar103,auVar188);
        auVar114 = vmaxps_avx(auVar113,auVar114);
        auVar113 = vandps_avx(auVar99,auVar188);
        auVar113 = vmaxps_avx(auVar114,auVar113);
        auVar99 = vbroadcastss_avx512vl(auVar92);
        uVar79 = vcmpps_avx512vl(auVar113,auVar99,1);
        bVar87 = (bool)((byte)uVar79 & 1);
        auVar115._0_4_ = (float)((uint)bVar87 * auVar106._0_4_ | (uint)!bVar87 * auVar109._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar87 * auVar106._4_4_ | (uint)!bVar87 * auVar109._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar87 * auVar106._8_4_ | (uint)!bVar87 * auVar109._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar87 * auVar106._12_4_ | (uint)!bVar87 * auVar109._12_4_);
        bVar87 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar87 * auVar106._16_4_ | (uint)!bVar87 * auVar109._16_4_);
        bVar87 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar87 * auVar106._20_4_ | (uint)!bVar87 * auVar109._20_4_);
        bVar87 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar87 * auVar106._24_4_ | (uint)!bVar87 * auVar109._24_4_);
        bVar87 = SUB81(uVar79 >> 7,0);
        auVar115._28_4_ = (uint)bVar87 * auVar106._28_4_ | (uint)!bVar87 * auVar109._28_4_;
        bVar87 = (bool)((byte)uVar79 & 1);
        auVar116._0_4_ = (float)((uint)bVar87 * auVar107._0_4_ | (uint)!bVar87 * auVar103._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar87 * auVar107._4_4_ | (uint)!bVar87 * auVar103._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar87 * auVar107._8_4_ | (uint)!bVar87 * auVar103._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar87 * auVar107._12_4_ | (uint)!bVar87 * auVar103._12_4_);
        bVar87 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar87 * auVar107._16_4_ | (uint)!bVar87 * auVar103._16_4_);
        bVar87 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar87 * auVar107._20_4_ | (uint)!bVar87 * auVar103._20_4_);
        bVar87 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar87 * auVar107._24_4_ | (uint)!bVar87 * auVar103._24_4_);
        bVar87 = SUB81(uVar79 >> 7,0);
        auVar116._28_4_ = (uint)bVar87 * auVar107._28_4_ | (uint)!bVar87 * auVar103._28_4_;
        auVar113 = vandps_avx(auVar188,auVar112);
        auVar114 = vandps_avx(auVar111,auVar188);
        auVar114 = vmaxps_avx(auVar113,auVar114);
        auVar113 = vandps_avx(auVar110,auVar188);
        auVar113 = vmaxps_avx(auVar114,auVar113);
        uVar79 = vcmpps_avx512vl(auVar113,auVar99,1);
        bVar87 = (bool)((byte)uVar79 & 1);
        auVar117._0_4_ = (float)((uint)bVar87 * auVar106._0_4_ | (uint)!bVar87 * auVar112._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar87 * auVar106._4_4_ | (uint)!bVar87 * auVar112._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar87 * auVar106._8_4_ | (uint)!bVar87 * auVar112._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar87 * auVar106._12_4_ | (uint)!bVar87 * auVar112._12_4_);
        bVar87 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar87 * auVar106._16_4_ | (uint)!bVar87 * auVar112._16_4_);
        bVar87 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar87 * auVar106._20_4_ | (uint)!bVar87 * auVar112._20_4_);
        bVar87 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar87 * auVar106._24_4_ | (uint)!bVar87 * auVar112._24_4_);
        bVar87 = SUB81(uVar79 >> 7,0);
        auVar117._28_4_ = (uint)bVar87 * auVar106._28_4_ | (uint)!bVar87 * auVar112._28_4_;
        bVar87 = (bool)((byte)uVar79 & 1);
        auVar118._0_4_ = (float)((uint)bVar87 * auVar107._0_4_ | (uint)!bVar87 * auVar111._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar87 * auVar107._4_4_ | (uint)!bVar87 * auVar111._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar87 * auVar107._8_4_ | (uint)!bVar87 * auVar111._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar87 * auVar107._12_4_ | (uint)!bVar87 * auVar111._12_4_);
        bVar87 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar87 * auVar107._16_4_ | (uint)!bVar87 * auVar111._16_4_);
        bVar87 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar87 * auVar107._20_4_ | (uint)!bVar87 * auVar111._20_4_);
        bVar87 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar87 * auVar107._24_4_ | (uint)!bVar87 * auVar111._24_4_);
        bVar87 = SUB81(uVar79 >> 7,0);
        auVar118._28_4_ = (uint)bVar87 * auVar107._28_4_ | (uint)!bVar87 * auVar111._28_4_;
        auVar94 = vxorps_avx512vl(auVar91,auVar91);
        auVar194 = ZEXT1664(auVar94);
        auVar113 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar94));
        auVar91 = vfmadd231ps_fma(auVar113,auVar116,auVar116);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar154 = auVar113._0_4_;
        fVar147 = auVar113._4_4_;
        fVar167 = auVar113._8_4_;
        fVar168 = auVar113._12_4_;
        fVar169 = auVar113._16_4_;
        fVar162 = auVar113._20_4_;
        fVar88 = auVar113._24_4_;
        auVar37._4_4_ = fVar147 * fVar147 * fVar147 * auVar91._4_4_ * -0.5;
        auVar37._0_4_ = fVar154 * fVar154 * fVar154 * auVar91._0_4_ * -0.5;
        auVar37._8_4_ = fVar167 * fVar167 * fVar167 * auVar91._8_4_ * -0.5;
        auVar37._12_4_ = fVar168 * fVar168 * fVar168 * auVar91._12_4_ * -0.5;
        auVar37._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar37._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar37._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
        auVar37._28_4_ = 0;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar37,auVar114,auVar113);
        auVar38._4_4_ = auVar116._4_4_ * auVar112._4_4_;
        auVar38._0_4_ = auVar116._0_4_ * auVar112._0_4_;
        auVar38._8_4_ = auVar116._8_4_ * auVar112._8_4_;
        auVar38._12_4_ = auVar116._12_4_ * auVar112._12_4_;
        auVar38._16_4_ = auVar116._16_4_ * auVar112._16_4_;
        auVar38._20_4_ = auVar116._20_4_ * auVar112._20_4_;
        auVar38._24_4_ = auVar116._24_4_ * auVar112._24_4_;
        auVar38._28_4_ = auVar113._28_4_;
        auVar39._4_4_ = auVar112._4_4_ * -auVar115._4_4_;
        auVar39._0_4_ = auVar112._0_4_ * -auVar115._0_4_;
        auVar39._8_4_ = auVar112._8_4_ * -auVar115._8_4_;
        auVar39._12_4_ = auVar112._12_4_ * -auVar115._12_4_;
        auVar39._16_4_ = auVar112._16_4_ * -auVar115._16_4_;
        auVar39._20_4_ = auVar112._20_4_ * -auVar115._20_4_;
        auVar39._24_4_ = auVar112._24_4_ * -auVar115._24_4_;
        auVar39._28_4_ = auVar115._28_4_ ^ 0x80000000;
        auVar113 = vmulps_avx512vl(auVar112,ZEXT1632(auVar94));
        auVar106 = ZEXT1632(auVar94);
        auVar111 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar106);
        auVar91 = vfmadd231ps_fma(auVar111,auVar118,auVar118);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar154 = auVar111._0_4_;
        fVar147 = auVar111._4_4_;
        fVar167 = auVar111._8_4_;
        fVar168 = auVar111._12_4_;
        fVar169 = auVar111._16_4_;
        fVar162 = auVar111._20_4_;
        fVar88 = auVar111._24_4_;
        auVar40._4_4_ = fVar147 * fVar147 * fVar147 * auVar91._4_4_ * -0.5;
        auVar40._0_4_ = fVar154 * fVar154 * fVar154 * auVar91._0_4_ * -0.5;
        auVar40._8_4_ = fVar167 * fVar167 * fVar167 * auVar91._8_4_ * -0.5;
        auVar40._12_4_ = fVar168 * fVar168 * fVar168 * auVar91._12_4_ * -0.5;
        auVar40._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar40._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar40._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
        auVar40._28_4_ = 0;
        auVar114 = vfmadd231ps_avx512vl(auVar40,auVar114,auVar111);
        auVar41._4_4_ = auVar118._4_4_ * auVar114._4_4_;
        auVar41._0_4_ = auVar118._0_4_ * auVar114._0_4_;
        auVar41._8_4_ = auVar118._8_4_ * auVar114._8_4_;
        auVar41._12_4_ = auVar118._12_4_ * auVar114._12_4_;
        auVar41._16_4_ = auVar118._16_4_ * auVar114._16_4_;
        auVar41._20_4_ = auVar118._20_4_ * auVar114._20_4_;
        auVar41._24_4_ = auVar118._24_4_ * auVar114._24_4_;
        auVar41._28_4_ = auVar111._28_4_;
        auVar42._4_4_ = -auVar117._4_4_ * auVar114._4_4_;
        auVar42._0_4_ = -auVar117._0_4_ * auVar114._0_4_;
        auVar42._8_4_ = -auVar117._8_4_ * auVar114._8_4_;
        auVar42._12_4_ = -auVar117._12_4_ * auVar114._12_4_;
        auVar42._16_4_ = -auVar117._16_4_ * auVar114._16_4_;
        auVar42._20_4_ = -auVar117._20_4_ * auVar114._20_4_;
        auVar42._24_4_ = -auVar117._24_4_ * auVar114._24_4_;
        auVar42._28_4_ = auVar112._28_4_;
        auVar114 = vmulps_avx512vl(auVar114,auVar106);
        auVar91 = vfmadd213ps_fma(auVar38,auVar108,auVar95);
        auVar193 = vfmadd213ps_fma(auVar39,auVar108,auVar96);
        auVar112 = vfmadd213ps_avx512vl(auVar113,auVar108,auVar105);
        auVar111 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar9),auVar98);
        auVar13 = vfnmadd213ps_fma(auVar38,auVar108,auVar95);
        auVar99 = ZEXT1632(auVar9);
        auVar10 = vfmadd213ps_fma(auVar42,auVar99,auVar97);
        auVar93 = vfnmadd213ps_fma(auVar39,auVar108,auVar96);
        auVar90 = vfmadd213ps_fma(auVar114,auVar99,auVar104);
        auVar103 = vfnmadd231ps_avx512vl(auVar105,auVar108,auVar113);
        auVar155 = vfnmadd213ps_fma(auVar41,auVar99,auVar98);
        auVar156 = vfnmadd213ps_fma(auVar42,auVar99,auVar97);
        auVar175 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar9),auVar114);
        auVar114 = vsubps_avx512vl(auVar111,ZEXT1632(auVar13));
        auVar113 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar93));
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar90),auVar103);
        auVar105 = vmulps_avx512vl(auVar113,auVar103);
        auVar11 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar93),auVar104);
        auVar43._4_4_ = auVar13._4_4_ * auVar104._4_4_;
        auVar43._0_4_ = auVar13._0_4_ * auVar104._0_4_;
        auVar43._8_4_ = auVar13._8_4_ * auVar104._8_4_;
        auVar43._12_4_ = auVar13._12_4_ * auVar104._12_4_;
        auVar43._16_4_ = auVar104._16_4_ * 0.0;
        auVar43._20_4_ = auVar104._20_4_ * 0.0;
        auVar43._24_4_ = auVar104._24_4_ * 0.0;
        auVar43._28_4_ = auVar104._28_4_;
        auVar104 = vfmsub231ps_avx512vl(auVar43,auVar103,auVar114);
        auVar44._4_4_ = auVar93._4_4_ * auVar114._4_4_;
        auVar44._0_4_ = auVar93._0_4_ * auVar114._0_4_;
        auVar44._8_4_ = auVar93._8_4_ * auVar114._8_4_;
        auVar44._12_4_ = auVar93._12_4_ * auVar114._12_4_;
        auVar44._16_4_ = auVar114._16_4_ * 0.0;
        auVar44._20_4_ = auVar114._20_4_ * 0.0;
        auVar44._24_4_ = auVar114._24_4_ * 0.0;
        auVar44._28_4_ = auVar114._28_4_;
        auVar12 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar13),auVar113);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar106,auVar104);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,ZEXT1632(auVar11));
        auVar98 = ZEXT1632(auVar94);
        uVar79 = vcmpps_avx512vl(auVar113,auVar98,2);
        bVar80 = (byte)uVar79;
        fVar88 = (float)((uint)(bVar80 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar155._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar153 = (float)((uint)bVar87 * auVar91._4_4_ | (uint)!bVar87 * auVar155._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar135 = (float)((uint)bVar87 * auVar91._8_4_ | (uint)!bVar87 * auVar155._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar138 = (float)((uint)bVar87 * auVar91._12_4_ | (uint)!bVar87 * auVar155._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar153,fVar88))));
        fVar89 = (float)((uint)(bVar80 & 1) * auVar193._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar156._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar134 = (float)((uint)bVar87 * auVar193._4_4_ | (uint)!bVar87 * auVar156._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar136 = (float)((uint)bVar87 * auVar193._8_4_ | (uint)!bVar87 * auVar156._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar139 = (float)((uint)bVar87 * auVar193._12_4_ | (uint)!bVar87 * auVar156._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar89))));
        auVar119._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar112._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar175._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar87 * auVar112._4_4_ | (uint)!bVar87 * auVar175._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar87 * auVar112._8_4_ | (uint)!bVar87 * auVar175._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar87 * auVar112._12_4_ | (uint)!bVar87 * auVar175._12_4_);
        fVar154 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar112._16_4_);
        auVar119._16_4_ = fVar154;
        fVar147 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar112._20_4_);
        auVar119._20_4_ = fVar147;
        fVar167 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar112._24_4_);
        auVar119._24_4_ = fVar167;
        iVar1 = (uint)(byte)(uVar79 >> 7) * auVar112._28_4_;
        auVar119._28_4_ = iVar1;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar13),auVar111);
        auVar120._0_4_ =
             (uint)(bVar80 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar11._0_4_;
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar87 * auVar114._4_4_ | (uint)!bVar87 * auVar11._4_4_;
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar87 * auVar114._8_4_ | (uint)!bVar87 * auVar11._8_4_;
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar87 * auVar114._12_4_ | (uint)!bVar87 * auVar11._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar114._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar114._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar114._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar10));
        auVar121._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar193._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar87 * auVar114._4_4_ | (uint)!bVar87 * auVar193._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar87 * auVar114._8_4_ | (uint)!bVar87 * auVar193._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar87 * auVar114._12_4_ | (uint)!bVar87 * auVar193._12_4_);
        fVar169 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar114._16_4_);
        auVar121._16_4_ = fVar169;
        fVar162 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar114._20_4_);
        auVar121._20_4_ = fVar162;
        fVar168 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar114._24_4_);
        auVar121._24_4_ = fVar168;
        auVar121._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(auVar103,ZEXT1632(auVar90));
        auVar122._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar112._0_4_);
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar87 * auVar114._4_4_ | (uint)!bVar87 * auVar112._4_4_);
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar87 * auVar114._8_4_ | (uint)!bVar87 * auVar112._8_4_);
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar87 * auVar114._12_4_ | (uint)!bVar87 * auVar112._12_4_);
        bVar87 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar87 * auVar114._16_4_ | (uint)!bVar87 * auVar112._16_4_);
        bVar87 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar87 * auVar114._20_4_ | (uint)!bVar87 * auVar112._20_4_);
        bVar87 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar87 * auVar114._24_4_ | (uint)!bVar87 * auVar112._24_4_);
        bVar87 = SUB81(uVar79 >> 7,0);
        auVar122._28_4_ = (uint)bVar87 * auVar114._28_4_ | (uint)!bVar87 * auVar112._28_4_;
        auVar123._0_4_ =
             (uint)(bVar80 & 1) * (int)auVar13._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar111._0_4_;
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar87 * (int)auVar13._4_4_ | (uint)!bVar87 * auVar111._4_4_;
        bVar87 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar87 * (int)auVar13._8_4_ | (uint)!bVar87 * auVar111._8_4_;
        bVar87 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar87 * (int)auVar13._12_4_ | (uint)!bVar87 * auVar111._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar111._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar111._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar111._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar111._28_4_;
        bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar80 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar90._0_4_;
        bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar90._4_4_;
        bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar90._8_4_;
        bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar90._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar103._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar103._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar103._24_4_;
        iVar2 = (uint)(byte)(uVar79 >> 7) * auVar103._28_4_;
        auVar124._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar123,auVar105);
        auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar93._12_4_ |
                                                 (uint)!bVar19 * auVar10._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar93._8_4_ |
                                                          (uint)!bVar18 * auVar10._8_4_,
                                                          CONCAT44((uint)bVar87 * (int)auVar93._4_4_
                                                                   | (uint)!bVar87 * auVar10._4_4_,
                                                                   (uint)(bVar80 & 1) *
                                                                   (int)auVar93._0_4_ |
                                                                   (uint)!(bool)(bVar80 & 1) *
                                                                   auVar10._0_4_)))),auVar99);
        auVar112 = vsubps_avx(auVar124,auVar119);
        auVar111 = vsubps_avx(auVar105,auVar120);
        auVar103 = vsubps_avx(auVar99,auVar121);
        auVar104 = vsubps_avx(auVar119,auVar122);
        auVar45._4_4_ = auVar112._4_4_ * fVar153;
        auVar45._0_4_ = auVar112._0_4_ * fVar88;
        auVar45._8_4_ = auVar112._8_4_ * fVar135;
        auVar45._12_4_ = auVar112._12_4_ * fVar138;
        auVar45._16_4_ = auVar112._16_4_ * 0.0;
        auVar45._20_4_ = auVar112._20_4_ * 0.0;
        auVar45._24_4_ = auVar112._24_4_ * 0.0;
        auVar45._28_4_ = iVar2;
        auVar91 = vfmsub231ps_fma(auVar45,auVar119,auVar95);
        auVar46._4_4_ = fVar134 * auVar95._4_4_;
        auVar46._0_4_ = fVar89 * auVar95._0_4_;
        auVar46._8_4_ = fVar136 * auVar95._8_4_;
        auVar46._12_4_ = fVar139 * auVar95._12_4_;
        auVar46._16_4_ = auVar95._16_4_ * 0.0;
        auVar46._20_4_ = auVar95._20_4_ * 0.0;
        auVar46._24_4_ = auVar95._24_4_ * 0.0;
        auVar46._28_4_ = auVar113._28_4_;
        auVar193 = vfmsub231ps_fma(auVar46,auVar105,auVar114);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar98,ZEXT1632(auVar91));
        auVar163._0_4_ = auVar114._0_4_ * auVar119._0_4_;
        auVar163._4_4_ = auVar114._4_4_ * auVar119._4_4_;
        auVar163._8_4_ = auVar114._8_4_ * auVar119._8_4_;
        auVar163._12_4_ = auVar114._12_4_ * auVar119._12_4_;
        auVar163._16_4_ = auVar114._16_4_ * fVar154;
        auVar163._20_4_ = auVar114._20_4_ * fVar147;
        auVar163._24_4_ = auVar114._24_4_ * fVar167;
        auVar163._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar163,auVar99,auVar112);
        auVar96 = vfmadd231ps_avx512vl(auVar113,auVar98,ZEXT1632(auVar91));
        auVar113 = vmulps_avx512vl(auVar104,auVar120);
        auVar113 = vfmsub231ps_avx512vl(auVar113,auVar111,auVar122);
        auVar47._4_4_ = auVar103._4_4_ * auVar122._4_4_;
        auVar47._0_4_ = auVar103._0_4_ * auVar122._0_4_;
        auVar47._8_4_ = auVar103._8_4_ * auVar122._8_4_;
        auVar47._12_4_ = auVar103._12_4_ * auVar122._12_4_;
        auVar47._16_4_ = auVar103._16_4_ * auVar122._16_4_;
        auVar47._20_4_ = auVar103._20_4_ * auVar122._20_4_;
        auVar47._24_4_ = auVar103._24_4_ * auVar122._24_4_;
        auVar47._28_4_ = auVar122._28_4_;
        auVar91 = vfmsub231ps_fma(auVar47,auVar121,auVar104);
        auVar164._0_4_ = auVar121._0_4_ * auVar111._0_4_;
        auVar164._4_4_ = auVar121._4_4_ * auVar111._4_4_;
        auVar164._8_4_ = auVar121._8_4_ * auVar111._8_4_;
        auVar164._12_4_ = auVar121._12_4_ * auVar111._12_4_;
        auVar164._16_4_ = fVar169 * auVar111._16_4_;
        auVar164._20_4_ = fVar162 * auVar111._20_4_;
        auVar164._24_4_ = fVar168 * auVar111._24_4_;
        auVar164._28_4_ = 0;
        auVar193 = vfmsub231ps_fma(auVar164,auVar103,auVar120);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar98,auVar113);
        auVar97 = vfmadd231ps_avx512vl(auVar113,auVar98,ZEXT1632(auVar91));
        auVar113 = vmaxps_avx(auVar96,auVar97);
        uVar143 = vcmpps_avx512vl(auVar113,auVar98,2);
        local_310 = local_310 & (byte)uVar143;
        in_ZMM20 = ZEXT3264(local_460);
        in_ZMM21 = ZEXT3264(local_480);
        auVar192 = ZEXT3264(local_420);
        auVar190 = ZEXT3264(local_500);
        auVar187 = ZEXT1664(auVar92);
        if (local_310 == 0) {
          local_310 = 0;
          auVar174 = ZEXT3264(auVar101);
          auVar152 = ZEXT3264(auVar102);
        }
        else {
          auVar48._4_4_ = auVar104._4_4_ * auVar114._4_4_;
          auVar48._0_4_ = auVar104._0_4_ * auVar114._0_4_;
          auVar48._8_4_ = auVar104._8_4_ * auVar114._8_4_;
          auVar48._12_4_ = auVar104._12_4_ * auVar114._12_4_;
          auVar48._16_4_ = auVar104._16_4_ * auVar114._16_4_;
          auVar48._20_4_ = auVar104._20_4_ * auVar114._20_4_;
          auVar48._24_4_ = auVar104._24_4_ * auVar114._24_4_;
          auVar48._28_4_ = auVar113._28_4_;
          auVar10 = vfmsub231ps_fma(auVar48,auVar103,auVar112);
          auVar49._4_4_ = auVar112._4_4_ * auVar111._4_4_;
          auVar49._0_4_ = auVar112._0_4_ * auVar111._0_4_;
          auVar49._8_4_ = auVar112._8_4_ * auVar111._8_4_;
          auVar49._12_4_ = auVar112._12_4_ * auVar111._12_4_;
          auVar49._16_4_ = auVar112._16_4_ * auVar111._16_4_;
          auVar49._20_4_ = auVar112._20_4_ * auVar111._20_4_;
          auVar49._24_4_ = auVar112._24_4_ * auVar111._24_4_;
          auVar49._28_4_ = auVar112._28_4_;
          auVar193 = vfmsub231ps_fma(auVar49,auVar95,auVar104);
          auVar50._4_4_ = auVar103._4_4_ * auVar95._4_4_;
          auVar50._0_4_ = auVar103._0_4_ * auVar95._0_4_;
          auVar50._8_4_ = auVar103._8_4_ * auVar95._8_4_;
          auVar50._12_4_ = auVar103._12_4_ * auVar95._12_4_;
          auVar50._16_4_ = auVar103._16_4_ * auVar95._16_4_;
          auVar50._20_4_ = auVar103._20_4_ * auVar95._20_4_;
          auVar50._24_4_ = auVar103._24_4_ * auVar95._24_4_;
          auVar50._28_4_ = auVar103._28_4_;
          auVar90 = vfmsub231ps_fma(auVar50,auVar111,auVar114);
          auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar193),ZEXT1632(auVar90));
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar10),auVar98);
          auVar114 = vrcp14ps_avx512vl(auVar113);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar112 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar26);
          auVar91 = vfmadd132ps_fma(auVar112,auVar114,auVar114);
          auVar51._4_4_ = auVar90._4_4_ * auVar119._4_4_;
          auVar51._0_4_ = auVar90._0_4_ * auVar119._0_4_;
          auVar51._8_4_ = auVar90._8_4_ * auVar119._8_4_;
          auVar51._12_4_ = auVar90._12_4_ * auVar119._12_4_;
          auVar51._16_4_ = fVar154 * 0.0;
          auVar51._20_4_ = fVar147 * 0.0;
          auVar51._24_4_ = fVar167 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar193 = vfmadd231ps_fma(auVar51,auVar99,ZEXT1632(auVar193));
          auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar105,ZEXT1632(auVar10));
          fVar147 = auVar91._0_4_;
          fVar167 = auVar91._4_4_;
          fVar168 = auVar91._8_4_;
          fVar169 = auVar91._12_4_;
          auVar114 = ZEXT1632(CONCAT412(auVar193._12_4_ * fVar169,
                                        CONCAT48(auVar193._8_4_ * fVar168,
                                                 CONCAT44(auVar193._4_4_ * fVar167,
                                                          auVar193._0_4_ * fVar147))));
          auVar152 = ZEXT3264(auVar114);
          auVar176._4_4_ = uVar84;
          auVar176._0_4_ = uVar84;
          auVar176._8_4_ = uVar84;
          auVar176._12_4_ = uVar84;
          auVar176._16_4_ = uVar84;
          auVar176._20_4_ = uVar84;
          auVar176._24_4_ = uVar84;
          auVar176._28_4_ = uVar84;
          uVar143 = vcmpps_avx512vl(auVar176,auVar114,2);
          fVar154 = ray->tfar;
          auVar27._4_4_ = fVar154;
          auVar27._0_4_ = fVar154;
          auVar27._8_4_ = fVar154;
          auVar27._12_4_ = fVar154;
          auVar27._16_4_ = fVar154;
          auVar27._20_4_ = fVar154;
          auVar27._24_4_ = fVar154;
          auVar27._28_4_ = fVar154;
          uVar24 = vcmpps_avx512vl(auVar114,auVar27,2);
          local_310 = (byte)uVar143 & (byte)uVar24 & local_310;
          if (local_310 == 0) {
            local_310 = 0;
            auVar174 = ZEXT3264(auVar101);
            auVar152 = ZEXT3264(auVar102);
          }
          else {
            uVar143 = vcmpps_avx512vl(auVar113,auVar98,4);
            if ((local_310 & (byte)uVar143) == 0) {
              local_310 = 0;
              auVar174 = ZEXT3264(auVar101);
              auVar152 = ZEXT3264(auVar102);
            }
            else {
              local_310 = local_310 & (byte)uVar143;
              fVar154 = auVar96._0_4_ * fVar147;
              fVar162 = auVar96._4_4_ * fVar167;
              auVar52._4_4_ = fVar162;
              auVar52._0_4_ = fVar154;
              fVar88 = auVar96._8_4_ * fVar168;
              auVar52._8_4_ = fVar88;
              fVar89 = auVar96._12_4_ * fVar169;
              auVar52._12_4_ = fVar89;
              fVar153 = auVar96._16_4_ * 0.0;
              auVar52._16_4_ = fVar153;
              fVar134 = auVar96._20_4_ * 0.0;
              auVar52._20_4_ = fVar134;
              fVar135 = auVar96._24_4_ * 0.0;
              auVar52._24_4_ = fVar135;
              auVar52._28_4_ = auVar96._28_4_;
              fVar147 = auVar97._0_4_ * fVar147;
              fVar167 = auVar97._4_4_ * fVar167;
              auVar53._4_4_ = fVar167;
              auVar53._0_4_ = fVar147;
              fVar168 = auVar97._8_4_ * fVar168;
              auVar53._8_4_ = fVar168;
              fVar169 = auVar97._12_4_ * fVar169;
              auVar53._12_4_ = fVar169;
              fVar136 = auVar97._16_4_ * 0.0;
              auVar53._16_4_ = fVar136;
              fVar138 = auVar97._20_4_ * 0.0;
              auVar53._20_4_ = fVar138;
              fVar139 = auVar97._24_4_ * 0.0;
              auVar53._24_4_ = fVar139;
              auVar53._28_4_ = auVar97._28_4_;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = &DAT_3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar102 = vsubps_avx(auVar172,auVar52);
              bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar79 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar79 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar79 >> 6) & 1);
              bVar22 = SUB81(uVar79 >> 7,0);
              auVar174 = ZEXT3264(CONCAT428((uint)bVar22 * auVar96._28_4_ |
                                            (uint)!bVar22 * auVar102._28_4_,
                                            CONCAT424((uint)bVar21 * (int)fVar135 |
                                                      (uint)!bVar21 * auVar102._24_4_,
                                                      CONCAT420((uint)bVar20 * (int)fVar134 |
                                                                (uint)!bVar20 * auVar102._20_4_,
                                                                CONCAT416((uint)bVar19 *
                                                                          (int)fVar153 |
                                                                          (uint)!bVar19 *
                                                                          auVar102._16_4_,
                                                                          CONCAT412((uint)bVar18 *
                                                                                    (int)fVar89 |
                                                                                    (uint)!bVar18 *
                                                                                    auVar102._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar17 * (int)fVar88 |
                                                  (uint)!bVar17 * auVar102._8_4_,
                                                  CONCAT44((uint)bVar87 * (int)fVar162 |
                                                           (uint)!bVar87 * auVar102._4_4_,
                                                           (uint)(bVar80 & 1) * (int)fVar154 |
                                                           (uint)!(bool)(bVar80 & 1) *
                                                           auVar102._0_4_))))))));
              auVar102 = vsubps_avx(auVar172,auVar53);
              bVar87 = (bool)((byte)(uVar79 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar79 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar79 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar79 >> 6) & 1);
              bVar22 = SUB81(uVar79 >> 7,0);
              local_260._4_4_ = (uint)bVar87 * (int)fVar167 | (uint)!bVar87 * auVar102._4_4_;
              local_260._0_4_ =
                   (uint)(bVar80 & 1) * (int)fVar147 | (uint)!(bool)(bVar80 & 1) * auVar102._0_4_;
              local_260._8_4_ = (uint)bVar17 * (int)fVar168 | (uint)!bVar17 * auVar102._8_4_;
              local_260._12_4_ = (uint)bVar18 * (int)fVar169 | (uint)!bVar18 * auVar102._12_4_;
              local_260._16_4_ = (uint)bVar19 * (int)fVar136 | (uint)!bVar19 * auVar102._16_4_;
              local_260._20_4_ = (uint)bVar20 * (int)fVar138 | (uint)!bVar20 * auVar102._20_4_;
              local_260._24_4_ = (uint)bVar21 * (int)fVar139 | (uint)!bVar21 * auVar102._24_4_;
              local_260._28_4_ = (uint)bVar22 * auVar97._28_4_ | (uint)!bVar22 * auVar102._28_4_;
            }
          }
        }
        auVar179 = ZEXT3264(auVar100);
        auVar177 = ZEXT1664(local_630);
        if (local_310 != 0) {
          auVar102 = vsubps_avx(ZEXT1632(auVar9),auVar108);
          local_5e0 = auVar174._0_32_;
          auVar91 = vfmadd213ps_fma(auVar102,local_5e0,auVar108);
          fVar154 = pre->depth_scale;
          auVar28._4_4_ = fVar154;
          auVar28._0_4_ = fVar154;
          auVar28._8_4_ = fVar154;
          auVar28._12_4_ = fVar154;
          auVar28._16_4_ = fVar154;
          auVar28._20_4_ = fVar154;
          auVar28._24_4_ = fVar154;
          auVar28._28_4_ = fVar154;
          auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                        CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                 CONCAT44(auVar91._4_4_ +
                                                                          auVar91._4_4_,
                                                                          auVar91._0_4_ +
                                                                          auVar91._0_4_)))),auVar28)
          ;
          local_600 = auVar152._0_32_;
          uVar143 = vcmpps_avx512vl(local_600,auVar102,6);
          local_310 = local_310 & (byte)uVar143;
          if (local_310 != 0) {
            auVar144._8_4_ = 0xbf800000;
            auVar144._0_8_ = 0xbf800000bf800000;
            auVar144._12_4_ = 0xbf800000;
            auVar144._16_4_ = 0xbf800000;
            auVar144._20_4_ = 0xbf800000;
            auVar144._24_4_ = 0xbf800000;
            auVar144._28_4_ = 0xbf800000;
            auVar29._8_4_ = 0x40000000;
            auVar29._0_8_ = 0x4000000040000000;
            auVar29._12_4_ = 0x40000000;
            auVar29._16_4_ = 0x40000000;
            auVar29._20_4_ = 0x40000000;
            auVar29._24_4_ = 0x40000000;
            auVar29._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_260,auVar144,auVar29);
            local_260 = local_3a0;
            auVar102 = local_260;
            local_360 = 0;
            if ((pGVar83->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar87 = true, pGVar83->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar154 = 1.0 / auVar184._0_4_;
                local_300[0] = fVar154 * (auVar174._0_4_ + 0.0);
                local_300[1] = fVar154 * (auVar174._4_4_ + 1.0);
                local_300[2] = fVar154 * (auVar174._8_4_ + 2.0);
                local_300[3] = fVar154 * (auVar174._12_4_ + 3.0);
                fStack_2f0 = fVar154 * (auVar174._16_4_ + 4.0);
                fStack_2ec = fVar154 * (auVar174._20_4_ + 5.0);
                fStack_2e8 = fVar154 * (auVar174._24_4_ + 6.0);
                fStack_2e4 = auVar174._28_4_ + 7.0;
                local_260._0_8_ = local_3a0._0_8_;
                local_260._8_8_ = local_3a0._8_8_;
                local_260._16_8_ = local_3a0._16_8_;
                local_260._24_8_ = local_3a0._24_8_;
                local_2e0 = local_260._0_8_;
                uStack_2d8 = local_260._8_8_;
                uStack_2d0 = local_260._16_8_;
                uStack_2c8 = local_260._24_8_;
                local_2c0 = local_600;
                local_4c0 = (float)local_510;
                uStack_4bc = (undefined4)((ulong)local_510 >> 0x20);
                lVar86 = 0;
                uVar82 = (ulong)local_310;
                for (uVar79 = uVar82; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000)
                {
                  lVar86 = lVar86 + 1;
                }
                bVar87 = true;
                local_640 = ray;
                local_638 = context;
                local_618 = pre;
                local_550 = local_4b0;
                uStack_548 = uStack_4a8;
                uStack_538 = uStack_518;
                local_530 = auVar92;
                local_4e0 = auVar100;
                uStack_4b8 = uStack_508;
                local_3c0 = local_5e0;
                local_380 = local_600;
                local_35c = iVar15;
                local_350 = local_630;
                local_340 = local_510;
                uStack_338 = uStack_508;
                local_330 = local_540;
                uStack_328 = uStack_518;
                local_320 = local_4b0;
                uStack_318 = uStack_4a8;
                local_260 = auVar102;
                do {
                  auVar193 = auVar194._0_16_;
                  local_584 = local_300[lVar86];
                  local_580 = *(undefined4 *)((long)&local_2e0 + lVar86 * 4);
                  local_610 = CONCAT44(local_610._4_4_,ray->tfar);
                  local_2a0 = (uint)lVar86;
                  uStack_29c = (uint)((ulong)lVar86 >> 0x20);
                  ray->tfar = *(float *)(local_2c0 + lVar86 * 4);
                  local_5c0.context = context->user;
                  fVar147 = 1.0 - local_584;
                  fVar154 = fVar147 * fVar147 * -3.0;
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                            ZEXT416((uint)(local_584 * fVar147)),ZEXT416(0xc0000000)
                                           );
                  auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_584 * fVar147)),
                                            ZEXT416((uint)(local_584 * local_584)),
                                            ZEXT416(0x40000000));
                  fVar147 = auVar92._0_4_ * 3.0;
                  fVar167 = auVar91._0_4_ * 3.0;
                  fVar168 = local_584 * local_584 * 3.0;
                  auVar170._0_4_ = fVar168 * (float)local_550;
                  auVar170._4_4_ = fVar168 * local_550._4_4_;
                  auVar170._8_4_ = fVar168 * (float)uStack_548;
                  auVar170._12_4_ = fVar168 * uStack_548._4_4_;
                  auVar148._4_4_ = fVar167;
                  auVar148._0_4_ = fVar167;
                  auVar148._8_4_ = fVar167;
                  auVar148._12_4_ = fVar167;
                  auVar73._8_8_ = uStack_538;
                  auVar73._0_8_ = local_540;
                  auVar92 = vfmadd132ps_fma(auVar148,auVar170,auVar73);
                  auVar157._4_4_ = fVar147;
                  auVar157._0_4_ = fVar147;
                  auVar157._8_4_ = fVar147;
                  auVar157._12_4_ = fVar147;
                  auVar74._4_4_ = uStack_4bc;
                  auVar74._0_4_ = local_4c0;
                  auVar74._8_8_ = uStack_4b8;
                  auVar92 = vfmadd132ps_fma(auVar157,auVar92,auVar74);
                  auVar149._4_4_ = fVar154;
                  auVar149._0_4_ = fVar154;
                  auVar149._8_4_ = fVar154;
                  auVar149._12_4_ = fVar154;
                  auVar92 = vfmadd213ps_fma(auVar149,auVar177._0_16_,auVar92);
                  local_590 = vmovlps_avx(auVar92);
                  local_588 = vextractps_avx(auVar92,2);
                  local_57c = (undefined4)local_558;
                  local_578 = (undefined4)local_608;
                  local_574 = (local_5c0.context)->instID[0];
                  local_570 = (local_5c0.context)->instPrimID[0];
                  local_644 = -1;
                  local_5c0.valid = &local_644;
                  local_5c0.geometryUserPtr = pGVar83->userPtr;
                  local_5c0.hit = (RTCHitN *)&local_590;
                  local_5c0.N = 1;
                  local_400 = (float)uVar82;
                  fStack_3fc = (float)(uVar82 >> 0x20);
                  local_5c0.ray = (RTCRayN *)ray;
                  if (pGVar83->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01df53e3:
                    auVar100 = auVar179._0_32_;
                    auVar92 = auVar194._0_16_;
                    p_Var16 = context->args->filter;
                    fVar154 = auVar187._0_4_;
                    if (p_Var16 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar83->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var16)(&local_5c0);
                      auVar187 = ZEXT1664(local_530);
                      auVar179 = ZEXT3264(local_4e0);
                      auVar190 = ZEXT3264(local_500);
                      auVar191 = ZEXT3264(local_440);
                      auVar192 = ZEXT3264(local_420);
                      auVar177 = ZEXT1664(local_630);
                      in_ZMM21 = ZEXT3264(local_480);
                      in_ZMM20 = ZEXT3264(local_460);
                      auVar92 = vxorps_avx512vl(auVar92,auVar92);
                      auVar194 = ZEXT1664(auVar92);
                      context = local_638;
                      ray = local_640;
                      pre = local_618;
                      uVar84 = local_4a0._0_4_;
                    }
                    auVar100 = auVar179._0_32_;
                    uVar82 = CONCAT44(fStack_3fc,local_400);
                    fVar154 = auVar187._0_4_;
                    if (*local_5c0.valid != 0) break;
                  }
                  else {
                    (*pGVar83->occlusionFilterN)(&local_5c0);
                    uVar82 = CONCAT44(fStack_3fc,local_400);
                    auVar187 = ZEXT1664(local_530);
                    auVar179 = ZEXT3264(local_4e0);
                    auVar190 = ZEXT3264(local_500);
                    auVar191 = ZEXT3264(local_440);
                    auVar192 = ZEXT3264(local_420);
                    auVar177 = ZEXT1664(local_630);
                    in_ZMM21 = ZEXT3264(local_480);
                    in_ZMM20 = ZEXT3264(local_460);
                    auVar92 = vxorps_avx512vl(auVar193,auVar193);
                    auVar194 = ZEXT1664(auVar92);
                    context = local_638;
                    ray = local_640;
                    pre = local_618;
                    uVar84 = local_4a0._0_4_;
                    if (*local_5c0.valid != 0) goto LAB_01df53e3;
                  }
                  auVar100 = auVar179._0_32_;
                  ray->tfar = (float)local_610;
                  lVar86 = 0;
                  uVar82 = uVar82 ^ 1L << ((ulong)local_2a0 & 0x3f);
                  for (uVar79 = uVar82; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000
                      ) {
                    lVar86 = lVar86 + 1;
                  }
                  bVar87 = uVar82 != 0;
                  fVar154 = auVar187._0_4_;
                } while (bVar87);
                local_400 = fVar154;
                auVar174 = ZEXT3264(local_5e0);
                auVar152 = ZEXT3264(local_600);
              }
              goto LAB_01df551b;
            }
          }
        }
        bVar87 = false;
      }
LAB_01df551b:
      local_638 = context;
      local_640 = ray;
      local_618 = pre;
      if (8 < iVar15) {
        local_4a0 = vpbroadcastd_avx512vl();
        local_2a0 = uVar84;
        uStack_29c = uVar84;
        uStack_298 = uVar84;
        uStack_294 = uVar84;
        uStack_290 = uVar84;
        uStack_28c = uVar84;
        uStack_288 = uVar84;
        uStack_284 = uVar84;
        fStack_3d0 = 1.0 / local_3e0;
        auStack_3dc._0_4_ = fStack_3d0;
        local_3e0 = fStack_3d0;
        auStack_3dc._4_4_ = fStack_3d0;
        fStack_3d4 = fStack_3d0;
        lVar86 = 8;
        local_5e0 = auVar174._0_32_;
        local_600 = auVar152._0_32_;
        local_4e0 = auVar100;
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        fStack_3f0 = local_400;
        fStack_3ec = local_400;
        fStack_3e8 = local_400;
        fStack_3e4 = local_400;
        fStack_3cc = fStack_3d0;
        fStack_3c8 = fStack_3d0;
        fStack_3c4 = fStack_3d0;
        do {
          auVar102 = vpbroadcastd_avx512vl();
          auVar112 = vpor_avx2(auVar102,_DAT_0205a920);
          uVar24 = vpcmpd_avx512vl(auVar112,local_4a0,1);
          auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 * 4 + lVar25);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar86 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar86 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar25 + 0x2228070 + lVar86 * 4);
          auVar111 = vmulps_avx512vl(local_160,auVar114);
          auVar103 = vmulps_avx512vl(local_180,auVar114);
          auVar54._4_4_ = auVar114._4_4_ * (float)local_1a0._4_4_;
          auVar54._0_4_ = auVar114._0_4_ * (float)local_1a0._0_4_;
          auVar54._8_4_ = auVar114._8_4_ * fStack_198;
          auVar54._12_4_ = auVar114._12_4_ * fStack_194;
          auVar54._16_4_ = auVar114._16_4_ * fStack_190;
          auVar54._20_4_ = auVar114._20_4_ * fStack_18c;
          auVar54._24_4_ = auVar114._24_4_ * fStack_188;
          auVar54._28_4_ = auVar112._28_4_;
          auVar112 = vfmadd231ps_avx512vl(auVar111,auVar113,local_100);
          auVar111 = vfmadd231ps_avx512vl(auVar103,auVar113,local_120);
          auVar103 = vfmadd231ps_avx512vl(auVar54,auVar113,local_140);
          auVar108 = auVar190._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,auVar108);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,local_c0);
          auVar92 = vfmadd231ps_fma(auVar103,auVar101,local_e0);
          auVar110 = auVar192._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar112,auVar102,auVar110);
          auVar109 = auVar191._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar111,auVar102,auVar109);
          auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 * 4 + lVar25);
          auVar111 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar86 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar102,local_a0);
          auVar103 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar86 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar25 + 0x222a490 + lVar86 * 4);
          auVar105 = vmulps_avx512vl(local_160,auVar104);
          auVar99 = vmulps_avx512vl(local_180,auVar104);
          auVar55._4_4_ = auVar104._4_4_ * (float)local_1a0._4_4_;
          auVar55._0_4_ = auVar104._0_4_ * (float)local_1a0._0_4_;
          auVar55._8_4_ = auVar104._8_4_ * fStack_198;
          auVar55._12_4_ = auVar104._12_4_ * fStack_194;
          auVar55._16_4_ = auVar104._16_4_ * fStack_190;
          auVar55._20_4_ = auVar104._20_4_ * fStack_18c;
          auVar55._24_4_ = auVar104._24_4_ * fStack_188;
          auVar55._28_4_ = uStack_184;
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_100);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_120);
          auVar96 = vfmadd231ps_avx512vl(auVar55,auVar103,local_140);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar108);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar111,local_c0);
          auVar91 = vfmadd231ps_fma(auVar96,auVar111,local_e0);
          auVar96 = vfmadd231ps_avx512vl(auVar105,auVar112,auVar110);
          auVar97 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar109);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar112,local_a0);
          auVar98 = vmaxps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar91));
          auVar105 = vsubps_avx(auVar96,auVar100);
          auVar99 = vsubps_avx(auVar97,auVar95);
          auVar106 = vmulps_avx512vl(auVar95,auVar105);
          auVar107 = vmulps_avx512vl(auVar100,auVar99);
          auVar106 = vsubps_avx512vl(auVar106,auVar107);
          auVar107 = vmulps_avx512vl(auVar99,auVar99);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar105);
          auVar98 = vmulps_avx512vl(auVar98,auVar98);
          auVar98 = vmulps_avx512vl(auVar98,auVar107);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          uVar143 = vcmpps_avx512vl(auVar106,auVar98,2);
          local_310 = (byte)uVar24 & (byte)uVar143;
          if (local_310 == 0) {
            auVar174 = ZEXT3264(local_5e0);
            auVar152 = ZEXT3264(local_600);
            auVar187 = ZEXT3264(auVar109);
            auVar190 = ZEXT3264(auVar108);
          }
          else {
            auVar104 = vmulps_avx512vl(local_4e0,auVar104);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_200,auVar104);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_1e0,auVar103);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_1c0,auVar111);
            auVar114 = vmulps_avx512vl(local_4e0,auVar114);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_200,auVar114);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_1e0,auVar113);
            auVar111 = vfmadd213ps_avx512vl(auVar102,local_1c0,auVar101);
            auVar102 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar86 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar86 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar86 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar25 + 0x2229280 + lVar86 * 4);
            auVar103 = vmulps_avx512vl(local_160,auVar114);
            auVar104 = vmulps_avx512vl(local_180,auVar114);
            auVar114 = vmulps_avx512vl(local_4e0,auVar114);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_100);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_120);
            auVar113 = vfmadd231ps_avx512vl(auVar114,local_200,auVar113);
            auVar114 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar108);
            auVar103 = vfmadd231ps_avx512vl(auVar104,auVar101,local_c0);
            auVar101 = vfmadd231ps_avx512vl(auVar113,local_1e0,auVar101);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar102,auVar110);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar109);
            auVar104 = vfmadd231ps_avx512vl(auVar101,local_1c0,auVar102);
            auVar102 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar86 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar86 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar25 + 0x222b6a0 + lVar86 * 4);
            auVar98 = vmulps_avx512vl(local_160,auVar113);
            auVar106 = vmulps_avx512vl(local_180,auVar113);
            auVar113 = vmulps_avx512vl(local_4e0,auVar113);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_100);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,local_120);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_200,auVar101);
            auVar101 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar86 * 4);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar108);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,local_c0);
            auVar101 = vfmadd231ps_avx512vl(auVar113,local_1e0,auVar101);
            auVar113 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar110);
            auVar98 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar109);
            auVar101 = vfmadd231ps_avx512vl(auVar101,local_1c0,auVar102);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar106);
            vandps_avx512vl(auVar103,auVar106);
            auVar102 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar104,auVar106);
            auVar102 = vmaxps_avx(auVar102,auVar106);
            auVar75._4_4_ = fStack_3fc;
            auVar75._0_4_ = local_400;
            auVar75._8_4_ = fStack_3f8;
            auVar75._12_4_ = fStack_3f4;
            auVar75._16_4_ = fStack_3f0;
            auVar75._20_4_ = fStack_3ec;
            auVar75._24_4_ = fStack_3e8;
            auVar75._28_4_ = fStack_3e4;
            uVar79 = vcmpps_avx512vl(auVar102,auVar75,1);
            bVar17 = (bool)((byte)uVar79 & 1);
            auVar125._0_4_ = (float)((uint)bVar17 * auVar105._0_4_ | (uint)!bVar17 * auVar114._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar114._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar114._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar114._12_4_);
            bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * auVar114._16_4_);
            bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * auVar114._20_4_);
            bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * auVar114._24_4_);
            bVar17 = SUB81(uVar79 >> 7,0);
            auVar125._28_4_ = (uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar114._28_4_;
            bVar17 = (bool)((byte)uVar79 & 1);
            auVar126._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar103._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar103._4_4_);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar103._8_4_);
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar103._12_4_);
            bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar103._16_4_);
            bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar103._20_4_);
            bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar103._24_4_);
            bVar17 = SUB81(uVar79 >> 7,0);
            auVar126._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar103._28_4_;
            vandps_avx512vl(auVar113,auVar106);
            vandps_avx512vl(auVar98,auVar106);
            auVar102 = vmaxps_avx(auVar126,auVar126);
            vandps_avx512vl(auVar101,auVar106);
            auVar102 = vmaxps_avx(auVar102,auVar126);
            uVar79 = vcmpps_avx512vl(auVar102,auVar75,1);
            bVar17 = (bool)((byte)uVar79 & 1);
            auVar127._0_4_ = (uint)bVar17 * auVar105._0_4_ | (uint)!bVar17 * auVar113._0_4_;
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar127._4_4_ = (uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar113._4_4_;
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar127._8_4_ = (uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar113._8_4_;
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar127._12_4_ = (uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar113._12_4_;
            bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar127._16_4_ = (uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * auVar113._16_4_;
            bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar127._20_4_ = (uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * auVar113._20_4_;
            bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar127._24_4_ = (uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * auVar113._24_4_;
            bVar17 = SUB81(uVar79 >> 7,0);
            auVar127._28_4_ = (uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar113._28_4_;
            bVar17 = (bool)((byte)uVar79 & 1);
            auVar128._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar98._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar98._4_4_);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar98._8_4_);
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar98._12_4_);
            bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar98._16_4_);
            bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar98._20_4_);
            bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar98._24_4_);
            bVar17 = SUB81(uVar79 >> 7,0);
            auVar128._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar98._28_4_;
            auVar181._8_4_ = 0x80000000;
            auVar181._0_8_ = 0x8000000080000000;
            auVar181._12_4_ = 0x80000000;
            auVar181._16_4_ = 0x80000000;
            auVar181._20_4_ = 0x80000000;
            auVar181._24_4_ = 0x80000000;
            auVar181._28_4_ = 0x80000000;
            auVar102 = vxorps_avx512vl(auVar127,auVar181);
            auVar98 = auVar194._0_32_;
            auVar101 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar98);
            auVar193 = vfmadd231ps_fma(auVar101,auVar126,auVar126);
            auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar193));
            auVar189._8_4_ = 0xbf000000;
            auVar189._0_8_ = 0xbf000000bf000000;
            auVar189._12_4_ = 0xbf000000;
            auVar189._16_4_ = 0xbf000000;
            auVar189._20_4_ = 0xbf000000;
            auVar189._24_4_ = 0xbf000000;
            auVar189._28_4_ = 0xbf000000;
            fVar154 = auVar101._0_4_;
            fVar147 = auVar101._4_4_;
            fVar167 = auVar101._8_4_;
            fVar168 = auVar101._12_4_;
            fVar169 = auVar101._16_4_;
            fVar162 = auVar101._20_4_;
            fVar88 = auVar101._24_4_;
            auVar56._4_4_ = fVar147 * fVar147 * fVar147 * auVar193._4_4_ * -0.5;
            auVar56._0_4_ = fVar154 * fVar154 * fVar154 * auVar193._0_4_ * -0.5;
            auVar56._8_4_ = fVar167 * fVar167 * fVar167 * auVar193._8_4_ * -0.5;
            auVar56._12_4_ = fVar168 * fVar168 * fVar168 * auVar193._12_4_ * -0.5;
            auVar56._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar56._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar56._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
            auVar56._28_4_ = auVar126._28_4_;
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar101 = vfmadd231ps_avx512vl(auVar56,auVar113,auVar101);
            auVar57._4_4_ = auVar126._4_4_ * auVar101._4_4_;
            auVar57._0_4_ = auVar126._0_4_ * auVar101._0_4_;
            auVar57._8_4_ = auVar126._8_4_ * auVar101._8_4_;
            auVar57._12_4_ = auVar126._12_4_ * auVar101._12_4_;
            auVar57._16_4_ = auVar126._16_4_ * auVar101._16_4_;
            auVar57._20_4_ = auVar126._20_4_ * auVar101._20_4_;
            auVar57._24_4_ = auVar126._24_4_ * auVar101._24_4_;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = auVar101._4_4_ * -auVar125._4_4_;
            auVar58._0_4_ = auVar101._0_4_ * -auVar125._0_4_;
            auVar58._8_4_ = auVar101._8_4_ * -auVar125._8_4_;
            auVar58._12_4_ = auVar101._12_4_ * -auVar125._12_4_;
            auVar58._16_4_ = auVar101._16_4_ * -auVar125._16_4_;
            auVar58._20_4_ = auVar101._20_4_ * -auVar125._20_4_;
            auVar58._24_4_ = auVar101._24_4_ * -auVar125._24_4_;
            auVar58._28_4_ = auVar126._28_4_;
            auVar114 = vmulps_avx512vl(auVar101,auVar98);
            auVar101 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar98);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar128,auVar128);
            auVar103 = vrsqrt14ps_avx512vl(auVar101);
            auVar101 = vmulps_avx512vl(auVar101,auVar189);
            fVar154 = auVar103._0_4_;
            fVar147 = auVar103._4_4_;
            fVar167 = auVar103._8_4_;
            fVar168 = auVar103._12_4_;
            fVar169 = auVar103._16_4_;
            fVar162 = auVar103._20_4_;
            fVar88 = auVar103._24_4_;
            auVar59._4_4_ = fVar147 * fVar147 * fVar147 * auVar101._4_4_;
            auVar59._0_4_ = fVar154 * fVar154 * fVar154 * auVar101._0_4_;
            auVar59._8_4_ = fVar167 * fVar167 * fVar167 * auVar101._8_4_;
            auVar59._12_4_ = fVar168 * fVar168 * fVar168 * auVar101._12_4_;
            auVar59._16_4_ = fVar169 * fVar169 * fVar169 * auVar101._16_4_;
            auVar59._20_4_ = fVar162 * fVar162 * fVar162 * auVar101._20_4_;
            auVar59._24_4_ = fVar88 * fVar88 * fVar88 * auVar101._24_4_;
            auVar59._28_4_ = auVar101._28_4_;
            auVar101 = vfmadd231ps_avx512vl(auVar59,auVar113,auVar103);
            auVar60._4_4_ = auVar128._4_4_ * auVar101._4_4_;
            auVar60._0_4_ = auVar128._0_4_ * auVar101._0_4_;
            auVar60._8_4_ = auVar128._8_4_ * auVar101._8_4_;
            auVar60._12_4_ = auVar128._12_4_ * auVar101._12_4_;
            auVar60._16_4_ = auVar128._16_4_ * auVar101._16_4_;
            auVar60._20_4_ = auVar128._20_4_ * auVar101._20_4_;
            auVar60._24_4_ = auVar128._24_4_ * auVar101._24_4_;
            auVar60._28_4_ = auVar103._28_4_;
            auVar61._4_4_ = auVar101._4_4_ * auVar102._4_4_;
            auVar61._0_4_ = auVar101._0_4_ * auVar102._0_4_;
            auVar61._8_4_ = auVar101._8_4_ * auVar102._8_4_;
            auVar61._12_4_ = auVar101._12_4_ * auVar102._12_4_;
            auVar61._16_4_ = auVar101._16_4_ * auVar102._16_4_;
            auVar61._20_4_ = auVar101._20_4_ * auVar102._20_4_;
            auVar61._24_4_ = auVar101._24_4_ * auVar102._24_4_;
            auVar61._28_4_ = auVar102._28_4_;
            auVar102 = vmulps_avx512vl(auVar101,auVar98);
            auVar193 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar92),auVar100);
            auVar101 = ZEXT1632(auVar92);
            auVar9 = vfmadd213ps_fma(auVar58,auVar101,auVar95);
            auVar113 = vfmadd213ps_avx512vl(auVar114,auVar101,auVar111);
            auVar103 = vfmadd213ps_avx512vl(auVar60,ZEXT1632(auVar91),auVar96);
            auVar13 = vfnmadd213ps_fma(auVar57,auVar101,auVar100);
            auVar104 = ZEXT1632(auVar91);
            auVar10 = vfmadd213ps_fma(auVar61,auVar104,auVar97);
            auVar93 = vfnmadd213ps_fma(auVar58,auVar101,auVar95);
            auVar90 = vfmadd213ps_fma(auVar102,auVar104,auVar112);
            auVar95 = ZEXT1632(auVar92);
            auVar175 = vfnmadd231ps_fma(auVar111,auVar95,auVar114);
            auVar155 = vfnmadd213ps_fma(auVar60,auVar104,auVar96);
            auVar156 = vfnmadd213ps_fma(auVar61,auVar104,auVar97);
            auVar94 = vfnmadd231ps_fma(auVar112,ZEXT1632(auVar91),auVar102);
            auVar112 = vsubps_avx512vl(auVar103,ZEXT1632(auVar13));
            auVar102 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar93));
            auVar101 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar175));
            auVar62._4_4_ = auVar102._4_4_ * auVar175._4_4_;
            auVar62._0_4_ = auVar102._0_4_ * auVar175._0_4_;
            auVar62._8_4_ = auVar102._8_4_ * auVar175._8_4_;
            auVar62._12_4_ = auVar102._12_4_ * auVar175._12_4_;
            auVar62._16_4_ = auVar102._16_4_ * 0.0;
            auVar62._20_4_ = auVar102._20_4_ * 0.0;
            auVar62._24_4_ = auVar102._24_4_ * 0.0;
            auVar62._28_4_ = auVar114._28_4_;
            auVar92 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar93),auVar101);
            auVar63._4_4_ = auVar101._4_4_ * auVar13._4_4_;
            auVar63._0_4_ = auVar101._0_4_ * auVar13._0_4_;
            auVar63._8_4_ = auVar101._8_4_ * auVar13._8_4_;
            auVar63._12_4_ = auVar101._12_4_ * auVar13._12_4_;
            auVar63._16_4_ = auVar101._16_4_ * 0.0;
            auVar63._20_4_ = auVar101._20_4_ * 0.0;
            auVar63._24_4_ = auVar101._24_4_ * 0.0;
            auVar63._28_4_ = auVar101._28_4_;
            auVar11 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar175),auVar112);
            auVar64._4_4_ = auVar93._4_4_ * auVar112._4_4_;
            auVar64._0_4_ = auVar93._0_4_ * auVar112._0_4_;
            auVar64._8_4_ = auVar93._8_4_ * auVar112._8_4_;
            auVar64._12_4_ = auVar93._12_4_ * auVar112._12_4_;
            auVar64._16_4_ = auVar112._16_4_ * 0.0;
            auVar64._20_4_ = auVar112._20_4_ * 0.0;
            auVar64._24_4_ = auVar112._24_4_ * 0.0;
            auVar64._28_4_ = auVar112._28_4_;
            auVar12 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar13),auVar102);
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar98,ZEXT1632(auVar11));
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar92));
            uVar79 = vcmpps_avx512vl(auVar102,auVar98,2);
            bVar80 = (byte)uVar79;
            fVar134 = (float)((uint)(bVar80 & 1) * auVar193._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * auVar155._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar136 = (float)((uint)bVar17 * auVar193._4_4_ | (uint)!bVar17 * auVar155._4_4_);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar139 = (float)((uint)bVar17 * auVar193._8_4_ | (uint)!bVar17 * auVar155._8_4_);
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar140 = (float)((uint)bVar17 * auVar193._12_4_ | (uint)!bVar17 * auVar155._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar136,fVar134))));
            fVar135 = (float)((uint)(bVar80 & 1) * auVar9._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * auVar156._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar138 = (float)((uint)bVar17 * auVar9._4_4_ | (uint)!bVar17 * auVar156._4_4_);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar137 = (float)((uint)bVar17 * auVar9._8_4_ | (uint)!bVar17 * auVar156._8_4_);
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar141 = (float)((uint)bVar17 * auVar9._12_4_ | (uint)!bVar17 * auVar156._12_4_);
            auVar105 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar137,CONCAT44(fVar138,fVar135))));
            auVar129._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar113._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar94._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * auVar94._4_4_);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * auVar94._8_4_);
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * auVar94._12_4_);
            fVar167 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar113._16_4_);
            auVar129._16_4_ = fVar167;
            fVar154 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar113._20_4_);
            auVar129._20_4_ = fVar154;
            fVar147 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar113._24_4_);
            auVar129._24_4_ = fVar147;
            iVar1 = (uint)(byte)(uVar79 >> 7) * auVar113._28_4_;
            auVar129._28_4_ = iVar1;
            auVar102 = vblendmps_avx512vl(ZEXT1632(auVar13),auVar103);
            auVar130._0_4_ =
                 (uint)(bVar80 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar92._0_4_;
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar92._4_4_;
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar92._8_4_;
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar92._12_4_;
            auVar130._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar102._16_4_;
            auVar130._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar102._20_4_;
            auVar130._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar102._24_4_;
            auVar130._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar102._28_4_;
            auVar102 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar10));
            auVar131._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar193._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar193._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar193._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar193._12_4_);
            fVar168 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar102._16_4_);
            auVar131._16_4_ = fVar168;
            fVar169 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar102._20_4_);
            auVar131._20_4_ = fVar169;
            fVar162 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar102._24_4_);
            auVar131._24_4_ = fVar162;
            auVar131._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar102._28_4_;
            auVar102 = vblendmps_avx512vl(ZEXT1632(auVar175),ZEXT1632(auVar90));
            auVar132._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar9._0_4_);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar9._4_4_);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar9._8_4_);
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar9._12_4_);
            fVar88 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar102._16_4_);
            auVar132._16_4_ = fVar88;
            fVar89 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar102._20_4_);
            auVar132._20_4_ = fVar89;
            fVar153 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar102._24_4_);
            auVar132._24_4_ = fVar153;
            iVar2 = (uint)(byte)(uVar79 >> 7) * auVar102._28_4_;
            auVar132._28_4_ = iVar2;
            auVar133._0_4_ =
                 (uint)(bVar80 & 1) * (int)auVar13._0_4_ |
                 (uint)!(bool)(bVar80 & 1) * auVar103._0_4_;
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar17 * (int)auVar13._4_4_ | (uint)!bVar17 * auVar103._4_4_;
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar17 * (int)auVar13._8_4_ | (uint)!bVar17 * auVar103._8_4_;
            bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar17 * (int)auVar13._12_4_ | (uint)!bVar17 * auVar103._12_4_;
            auVar133._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar103._16_4_;
            auVar133._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar103._20_4_;
            auVar133._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar103._24_4_;
            auVar133._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar103._28_4_;
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar79 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar103 = vsubps_avx512vl(auVar133,auVar104);
            auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar93._12_4_ |
                                                     (uint)!bVar21 * auVar10._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar93._8_4_ |
                                                              (uint)!bVar19 * auVar10._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar17 * auVar10._4_4_
                                                                       ,(uint)(bVar80 & 1) *
                                                                        (int)auVar93._0_4_ |
                                                                        (uint)!(bool)(bVar80 & 1) *
                                                                        auVar10._0_4_)))),auVar105);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar175._12_4_ |
                                                     (uint)!bVar22 * auVar90._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar175._8_4_ |
                                                              (uint)!bVar20 * auVar90._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar175._4_4_ |
                                                                       (uint)!bVar18 * auVar90._4_4_
                                                                       ,(uint)(bVar80 & 1) *
                                                                        (int)auVar175._0_4_ |
                                                                        (uint)!(bool)(bVar80 & 1) *
                                                                        auVar90._0_4_)))),auVar129);
            auVar114 = vsubps_avx(auVar104,auVar130);
            auVar112 = vsubps_avx(auVar105,auVar131);
            auVar111 = vsubps_avx(auVar129,auVar132);
            auVar65._4_4_ = auVar113._4_4_ * fVar136;
            auVar65._0_4_ = auVar113._0_4_ * fVar134;
            auVar65._8_4_ = auVar113._8_4_ * fVar139;
            auVar65._12_4_ = auVar113._12_4_ * fVar140;
            auVar65._16_4_ = auVar113._16_4_ * 0.0;
            auVar65._20_4_ = auVar113._20_4_ * 0.0;
            auVar65._24_4_ = auVar113._24_4_ * 0.0;
            auVar65._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar65,auVar129,auVar103);
            auVar161._0_4_ = fVar135 * auVar103._0_4_;
            auVar161._4_4_ = fVar138 * auVar103._4_4_;
            auVar161._8_4_ = fVar137 * auVar103._8_4_;
            auVar161._12_4_ = fVar141 * auVar103._12_4_;
            auVar161._16_4_ = auVar103._16_4_ * 0.0;
            auVar161._20_4_ = auVar103._20_4_ * 0.0;
            auVar161._24_4_ = auVar103._24_4_ * 0.0;
            auVar161._28_4_ = 0;
            auVar193 = vfmsub231ps_fma(auVar161,auVar104,auVar101);
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar98,ZEXT1632(auVar92));
            auVar165._0_4_ = auVar101._0_4_ * auVar129._0_4_;
            auVar165._4_4_ = auVar101._4_4_ * auVar129._4_4_;
            auVar165._8_4_ = auVar101._8_4_ * auVar129._8_4_;
            auVar165._12_4_ = auVar101._12_4_ * auVar129._12_4_;
            auVar165._16_4_ = auVar101._16_4_ * fVar167;
            auVar165._20_4_ = auVar101._20_4_ * fVar154;
            auVar165._24_4_ = auVar101._24_4_ * fVar147;
            auVar165._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar165,auVar105,auVar113);
            auVar99 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar92));
            auVar102 = vmulps_avx512vl(auVar111,auVar130);
            auVar102 = vfmsub231ps_avx512vl(auVar102,auVar114,auVar132);
            auVar66._4_4_ = auVar112._4_4_ * auVar132._4_4_;
            auVar66._0_4_ = auVar112._0_4_ * auVar132._0_4_;
            auVar66._8_4_ = auVar112._8_4_ * auVar132._8_4_;
            auVar66._12_4_ = auVar112._12_4_ * auVar132._12_4_;
            auVar66._16_4_ = auVar112._16_4_ * fVar88;
            auVar66._20_4_ = auVar112._20_4_ * fVar89;
            auVar66._24_4_ = auVar112._24_4_ * fVar153;
            auVar66._28_4_ = iVar2;
            auVar92 = vfmsub231ps_fma(auVar66,auVar131,auVar111);
            auVar166._0_4_ = auVar131._0_4_ * auVar114._0_4_;
            auVar166._4_4_ = auVar131._4_4_ * auVar114._4_4_;
            auVar166._8_4_ = auVar131._8_4_ * auVar114._8_4_;
            auVar166._12_4_ = auVar131._12_4_ * auVar114._12_4_;
            auVar166._16_4_ = fVar168 * auVar114._16_4_;
            auVar166._20_4_ = fVar169 * auVar114._20_4_;
            auVar166._24_4_ = fVar162 * auVar114._24_4_;
            auVar166._28_4_ = 0;
            auVar193 = vfmsub231ps_fma(auVar166,auVar112,auVar130);
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar98,auVar102);
            auVar100 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar92));
            auVar102 = vmaxps_avx(auVar99,auVar100);
            uVar143 = vcmpps_avx512vl(auVar102,auVar98,2);
            local_310 = local_310 & (byte)uVar143;
            auVar187 = ZEXT3264(auVar109);
            if (local_310 == 0) {
LAB_01df6046:
              local_310 = 0;
            }
            else {
              auVar67._4_4_ = auVar111._4_4_ * auVar101._4_4_;
              auVar67._0_4_ = auVar111._0_4_ * auVar101._0_4_;
              auVar67._8_4_ = auVar111._8_4_ * auVar101._8_4_;
              auVar67._12_4_ = auVar111._12_4_ * auVar101._12_4_;
              auVar67._16_4_ = auVar111._16_4_ * auVar101._16_4_;
              auVar67._20_4_ = auVar111._20_4_ * auVar101._20_4_;
              auVar67._24_4_ = auVar111._24_4_ * auVar101._24_4_;
              auVar67._28_4_ = auVar102._28_4_;
              auVar9 = vfmsub231ps_fma(auVar67,auVar112,auVar113);
              auVar68._4_4_ = auVar113._4_4_ * auVar114._4_4_;
              auVar68._0_4_ = auVar113._0_4_ * auVar114._0_4_;
              auVar68._8_4_ = auVar113._8_4_ * auVar114._8_4_;
              auVar68._12_4_ = auVar113._12_4_ * auVar114._12_4_;
              auVar68._16_4_ = auVar113._16_4_ * auVar114._16_4_;
              auVar68._20_4_ = auVar113._20_4_ * auVar114._20_4_;
              auVar68._24_4_ = auVar113._24_4_ * auVar114._24_4_;
              auVar68._28_4_ = auVar113._28_4_;
              auVar193 = vfmsub231ps_fma(auVar68,auVar103,auVar111);
              auVar69._4_4_ = auVar112._4_4_ * auVar103._4_4_;
              auVar69._0_4_ = auVar112._0_4_ * auVar103._0_4_;
              auVar69._8_4_ = auVar112._8_4_ * auVar103._8_4_;
              auVar69._12_4_ = auVar112._12_4_ * auVar103._12_4_;
              auVar69._16_4_ = auVar112._16_4_ * auVar103._16_4_;
              auVar69._20_4_ = auVar112._20_4_ * auVar103._20_4_;
              auVar69._24_4_ = auVar112._24_4_ * auVar103._24_4_;
              auVar69._28_4_ = auVar112._28_4_;
              auVar10 = vfmsub231ps_fma(auVar69,auVar114,auVar101);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar193),ZEXT1632(auVar10));
              auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar9),auVar98);
              auVar101 = vrcp14ps_avx512vl(auVar102);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar113 = vfnmadd213ps_avx512vl(auVar101,auVar102,auVar31);
              auVar92 = vfmadd132ps_fma(auVar113,auVar101,auVar101);
              auVar70._4_4_ = auVar10._4_4_ * auVar129._4_4_;
              auVar70._0_4_ = auVar10._0_4_ * auVar129._0_4_;
              auVar70._8_4_ = auVar10._8_4_ * auVar129._8_4_;
              auVar70._12_4_ = auVar10._12_4_ * auVar129._12_4_;
              auVar70._16_4_ = fVar167 * 0.0;
              auVar70._20_4_ = fVar154 * 0.0;
              auVar70._24_4_ = fVar147 * 0.0;
              auVar70._28_4_ = iVar1;
              auVar193 = vfmadd231ps_fma(auVar70,auVar105,ZEXT1632(auVar193));
              auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar104,ZEXT1632(auVar9));
              fVar147 = auVar92._0_4_;
              fVar167 = auVar92._4_4_;
              fVar168 = auVar92._8_4_;
              fVar169 = auVar92._12_4_;
              auVar101 = ZEXT1632(CONCAT412(auVar193._12_4_ * fVar169,
                                            CONCAT48(auVar193._8_4_ * fVar168,
                                                     CONCAT44(auVar193._4_4_ * fVar167,
                                                              auVar193._0_4_ * fVar147))));
              auVar76._4_4_ = uStack_29c;
              auVar76._0_4_ = local_2a0;
              auVar76._8_4_ = uStack_298;
              auVar76._12_4_ = uStack_294;
              auVar76._16_4_ = uStack_290;
              auVar76._20_4_ = uStack_28c;
              auVar76._24_4_ = uStack_288;
              auVar76._28_4_ = uStack_284;
              uVar143 = vcmpps_avx512vl(auVar101,auVar76,0xd);
              fVar154 = local_640->tfar;
              auVar32._4_4_ = fVar154;
              auVar32._0_4_ = fVar154;
              auVar32._8_4_ = fVar154;
              auVar32._12_4_ = fVar154;
              auVar32._16_4_ = fVar154;
              auVar32._20_4_ = fVar154;
              auVar32._24_4_ = fVar154;
              auVar32._28_4_ = fVar154;
              uVar24 = vcmpps_avx512vl(auVar101,auVar32,2);
              local_310 = (byte)uVar143 & (byte)uVar24 & local_310;
              if (local_310 == 0) goto LAB_01df6046;
              uVar143 = vcmpps_avx512vl(auVar102,auVar98,4);
              if ((local_310 & (byte)uVar143) == 0) {
                local_310 = 0;
              }
              else {
                local_310 = local_310 & (byte)uVar143;
                fVar154 = auVar99._0_4_ * fVar147;
                fVar162 = auVar99._4_4_ * fVar167;
                auVar71._4_4_ = fVar162;
                auVar71._0_4_ = fVar154;
                fVar88 = auVar99._8_4_ * fVar168;
                auVar71._8_4_ = fVar88;
                fVar89 = auVar99._12_4_ * fVar169;
                auVar71._12_4_ = fVar89;
                fVar153 = auVar99._16_4_ * 0.0;
                auVar71._16_4_ = fVar153;
                fVar134 = auVar99._20_4_ * 0.0;
                auVar71._20_4_ = fVar134;
                fVar135 = auVar99._24_4_ * 0.0;
                auVar71._24_4_ = fVar135;
                auVar71._28_4_ = auVar99._28_4_;
                fVar147 = auVar100._0_4_ * fVar147;
                fVar167 = auVar100._4_4_ * fVar167;
                auVar72._4_4_ = fVar167;
                auVar72._0_4_ = fVar147;
                fVar168 = auVar100._8_4_ * fVar168;
                auVar72._8_4_ = fVar168;
                fVar169 = auVar100._12_4_ * fVar169;
                auVar72._12_4_ = fVar169;
                fVar136 = auVar100._16_4_ * 0.0;
                auVar72._16_4_ = fVar136;
                fVar138 = auVar100._20_4_ * 0.0;
                auVar72._20_4_ = fVar138;
                fVar139 = auVar100._24_4_ * 0.0;
                auVar72._24_4_ = fVar139;
                auVar72._28_4_ = auVar100._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = &DAT_3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar102 = vsubps_avx512vl(auVar173,auVar71);
                bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar79 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar79 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar79 >> 6) & 1);
                bVar23 = SUB81(uVar79 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar23 * auVar99._28_4_ |
                                              (uint)!bVar23 * auVar102._28_4_,
                                              CONCAT424((uint)bVar22 * (int)fVar135 |
                                                        (uint)!bVar22 * auVar102._24_4_,
                                                        CONCAT420((uint)bVar21 * (int)fVar134 |
                                                                  (uint)!bVar21 * auVar102._20_4_,
                                                                  CONCAT416((uint)bVar20 *
                                                                            (int)fVar153 |
                                                                            (uint)!bVar20 *
                                                                            auVar102._16_4_,
                                                                            CONCAT412((uint)bVar19 *
                                                                                      (int)fVar89 |
                                                                                      (uint)!bVar19
                                                                                      * auVar102.
                                                  _12_4_,CONCAT48((uint)bVar18 * (int)fVar88 |
                                                                  (uint)!bVar18 * auVar102._8_4_,
                                                                  CONCAT44((uint)bVar17 *
                                                                           (int)fVar162 |
                                                                           (uint)!bVar17 *
                                                                           auVar102._4_4_,
                                                                           (uint)(bVar80 & 1) *
                                                                           (int)fVar154 |
                                                                           (uint)!(bool)(bVar80 & 1)
                                                                           * auVar102._0_4_))))))));
                auVar102 = vsubps_avx(auVar173,auVar72);
                bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar79 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar79 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar79 >> 6) & 1);
                bVar23 = SUB81(uVar79 >> 7,0);
                local_280._4_4_ = (uint)bVar17 * (int)fVar167 | (uint)!bVar17 * auVar102._4_4_;
                local_280._0_4_ =
                     (uint)(bVar80 & 1) * (int)fVar147 | (uint)!(bool)(bVar80 & 1) * auVar102._0_4_;
                local_280._8_4_ = (uint)bVar18 * (int)fVar168 | (uint)!bVar18 * auVar102._8_4_;
                local_280._12_4_ = (uint)bVar19 * (int)fVar169 | (uint)!bVar19 * auVar102._12_4_;
                local_280._16_4_ = (uint)bVar20 * (int)fVar136 | (uint)!bVar20 * auVar102._16_4_;
                local_280._20_4_ = (uint)bVar21 * (int)fVar138 | (uint)!bVar21 * auVar102._20_4_;
                local_280._24_4_ = (uint)bVar22 * (int)fVar139 | (uint)!bVar22 * auVar102._24_4_;
                local_280._28_4_ = (uint)bVar23 * auVar100._28_4_ | (uint)!bVar23 * auVar102._28_4_;
                in_ZMM21 = ZEXT3264(auVar101);
              }
            }
            auVar190 = ZEXT3264(local_500);
            auVar174 = ZEXT3264(local_5e0);
            auVar152 = ZEXT3264(local_600);
            if (local_310 != 0) {
              auVar102 = vsubps_avx(ZEXT1632(auVar91),auVar95);
              local_460 = in_ZMM20._0_32_;
              auVar102 = vfmadd213ps_avx512vl(auVar102,local_460,auVar95);
              auVar145._0_4_ = auVar102._0_4_ + auVar102._0_4_;
              auVar145._4_4_ = auVar102._4_4_ + auVar102._4_4_;
              auVar145._8_4_ = auVar102._8_4_ + auVar102._8_4_;
              auVar145._12_4_ = auVar102._12_4_ + auVar102._12_4_;
              auVar145._16_4_ = auVar102._16_4_ + auVar102._16_4_;
              auVar145._20_4_ = auVar102._20_4_ + auVar102._20_4_;
              auVar145._24_4_ = auVar102._24_4_ + auVar102._24_4_;
              auVar145._28_4_ = auVar102._28_4_ + auVar102._28_4_;
              fVar154 = local_618->depth_scale;
              auVar33._4_4_ = fVar154;
              auVar33._0_4_ = fVar154;
              auVar33._8_4_ = fVar154;
              auVar33._12_4_ = fVar154;
              auVar33._16_4_ = fVar154;
              auVar33._20_4_ = fVar154;
              auVar33._24_4_ = fVar154;
              auVar33._28_4_ = fVar154;
              auVar102 = vmulps_avx512vl(auVar145,auVar33);
              local_480 = in_ZMM21._0_32_;
              uVar143 = vcmpps_avx512vl(local_480,auVar102,6);
              local_310 = local_310 & (byte)uVar143;
              if (local_310 != 0) {
                auVar146._8_4_ = 0xbf800000;
                auVar146._0_8_ = 0xbf800000bf800000;
                auVar146._12_4_ = 0xbf800000;
                auVar146._16_4_ = 0xbf800000;
                auVar146._20_4_ = 0xbf800000;
                auVar146._24_4_ = 0xbf800000;
                auVar146._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_3a0 = vfmadd132ps_avx512vl(local_280,auVar146,auVar34);
                local_280 = local_3a0;
                auVar102 = local_280;
                local_360 = (undefined4)lVar86;
                local_350 = local_630;
                local_340 = local_510;
                uStack_338 = uStack_508;
                local_330 = local_520;
                uStack_328 = uStack_518;
                local_320 = local_4b0;
                uStack_318 = uStack_4a8;
                pGVar83 = (local_638->scene->geometries).items[local_608].ptr;
                if ((pGVar83->mask & local_640->mask) == 0) {
                  bVar80 = 0;
                }
                else if ((local_638->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar80 = 1, pGVar83->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar101 = vaddps_avx512vl(local_460,_DAT_02020f40);
                  auVar92 = vcvtsi2ss_avx512f(auVar191._0_16_,local_360);
                  fVar154 = auVar92._0_4_;
                  local_300[0] = (fVar154 + auVar101._0_4_) * local_3e0;
                  local_300[1] = (fVar154 + auVar101._4_4_) * (float)auStack_3dc._0_4_;
                  local_300[2] = (fVar154 + auVar101._8_4_) * (float)auStack_3dc._4_4_;
                  local_300[3] = (fVar154 + auVar101._12_4_) * fStack_3d4;
                  fStack_2f0 = (fVar154 + auVar101._16_4_) * fStack_3d0;
                  fStack_2ec = (fVar154 + auVar101._20_4_) * fStack_3cc;
                  fStack_2e8 = (fVar154 + auVar101._24_4_) * fStack_3c8;
                  fStack_2e4 = fVar154 + auVar101._28_4_;
                  local_280._0_8_ = local_3a0._0_8_;
                  local_280._8_8_ = local_3a0._8_8_;
                  local_280._16_8_ = local_3a0._16_8_;
                  local_280._24_8_ = local_3a0._24_8_;
                  local_2e0 = local_280._0_8_;
                  uStack_2d8 = local_280._8_8_;
                  uStack_2d0 = local_280._16_8_;
                  uStack_2c8 = local_280._24_8_;
                  local_2c0 = local_480;
                  local_210 = local_510;
                  uStack_208 = uStack_508;
                  lVar81 = 0;
                  uVar82 = (ulong)local_310;
                  for (uVar79 = uVar82; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000
                      ) {
                    lVar81 = lVar81 + 1;
                  }
                  local_220 = local_520;
                  uStack_218 = uStack_518;
                  local_230 = local_4b0;
                  uStack_228 = uStack_4a8;
                  local_550 = CONCAT44(local_550._4_4_,1);
                  local_540 = pGVar83;
                  local_3c0 = local_460;
                  local_380 = local_480;
                  local_35c = iVar15;
                  local_280 = auVar102;
                  do {
                    local_584 = local_300[lVar81];
                    local_580 = *(undefined4 *)((long)&local_2e0 + lVar81 * 4);
                    local_4c0 = local_640->tfar;
                    local_530._0_8_ = lVar81;
                    local_640->tfar = *(float *)(local_2c0 + lVar81 * 4);
                    local_5c0.context = local_638->user;
                    fVar147 = 1.0 - local_584;
                    fVar154 = fVar147 * fVar147 * -3.0;
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                              ZEXT416((uint)(local_584 * fVar147)),
                                              ZEXT416(0xc0000000));
                    auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_584 * fVar147)),
                                              ZEXT416((uint)(local_584 * local_584)),
                                              ZEXT416(0x40000000));
                    fVar147 = auVar92._0_4_ * 3.0;
                    fVar167 = auVar91._0_4_ * 3.0;
                    fVar168 = local_584 * local_584 * 3.0;
                    auVar171._0_4_ = fVar168 * (float)local_230;
                    auVar171._4_4_ = fVar168 * local_230._4_4_;
                    auVar171._8_4_ = fVar168 * (float)uStack_228;
                    auVar171._12_4_ = fVar168 * uStack_228._4_4_;
                    auVar150._4_4_ = fVar167;
                    auVar150._0_4_ = fVar167;
                    auVar150._8_4_ = fVar167;
                    auVar150._12_4_ = fVar167;
                    auVar77._8_8_ = uStack_218;
                    auVar77._0_8_ = local_220;
                    auVar92 = vfmadd132ps_fma(auVar150,auVar171,auVar77);
                    auVar158._4_4_ = fVar147;
                    auVar158._0_4_ = fVar147;
                    auVar158._8_4_ = fVar147;
                    auVar158._12_4_ = fVar147;
                    auVar78._8_8_ = uStack_208;
                    auVar78._0_8_ = local_210;
                    auVar92 = vfmadd132ps_fma(auVar158,auVar92,auVar78);
                    auVar151._4_4_ = fVar154;
                    auVar151._0_4_ = fVar154;
                    auVar151._8_4_ = fVar154;
                    auVar151._12_4_ = fVar154;
                    auVar92 = vfmadd213ps_fma(auVar151,local_630,auVar92);
                    local_590 = vmovlps_avx(auVar92);
                    local_588 = vextractps_avx(auVar92,2);
                    local_57c = (undefined4)local_558;
                    local_578 = (undefined4)local_608;
                    local_574 = (local_5c0.context)->instID[0];
                    local_570 = (local_5c0.context)->instPrimID[0];
                    local_644 = -1;
                    local_5c0.valid = &local_644;
                    local_5c0.geometryUserPtr = pGVar83->userPtr;
                    local_5c0.hit = (RTCHitN *)&local_590;
                    local_5c0.N = 1;
                    local_610 = uVar82;
                    local_5c0.ray = (RTCRayN *)local_640;
                    if ((pGVar83->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar83->occlusionFilterN)(&local_5c0), pGVar83 = local_540,
                       *local_5c0.valid != 0)) {
                      auVar92 = auVar194._0_16_;
                      p_Var16 = local_638->args->filter;
                      if (p_Var16 == (RTCFilterFunctionN)0x0) break;
                      if (((local_638->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar83->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var16)(&local_5c0);
                        pGVar83 = local_540;
                      }
                      auVar92 = auVar194._0_16_;
                      if (*local_5c0.valid != 0) break;
                    }
                    auVar92 = auVar194._0_16_;
                    local_640->tfar = local_4c0;
                    lVar81 = 0;
                    uVar82 = local_610 ^ 1L << (local_530._0_8_ & 0x3f);
                    for (uVar79 = uVar82; (uVar79 & 1) == 0;
                        uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                      lVar81 = lVar81 + 1;
                    }
                    local_550 = CONCAT44(local_550._4_4_,(int)CONCAT71(local_530._1_7_,uVar82 != 0))
                    ;
                  } while (uVar82 != 0);
                  bVar80 = (byte)local_550 & 1;
                  auVar92 = vxorps_avx512vl(auVar92,auVar92);
                  auVar194 = ZEXT1664(auVar92);
                  auVar174 = ZEXT3264(local_5e0);
                  in_ZMM20 = ZEXT3264(local_460);
                  auVar152 = ZEXT3264(local_600);
                  in_ZMM21 = ZEXT3264(local_480);
                  auVar192 = ZEXT3264(local_420);
                  auVar187 = ZEXT3264(local_440);
                  auVar190 = ZEXT3264(local_500);
                }
                bVar87 = (bool)(bVar87 | bVar80);
              }
            }
          }
          lVar86 = lVar86 + 8;
          auVar191 = auVar187;
        } while ((int)lVar86 < iVar15);
      }
      if (bVar87 != false) {
        return local_649;
      }
      fVar154 = local_640->tfar;
      auVar30._4_4_ = fVar154;
      auVar30._0_4_ = fVar154;
      auVar30._8_4_ = fVar154;
      auVar30._12_4_ = fVar154;
      auVar30._16_4_ = fVar154;
      auVar30._20_4_ = fVar154;
      auVar30._24_4_ = fVar154;
      auVar30._28_4_ = fVar154;
      uVar143 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar84 = (uint)uVar85 & (uint)uVar143;
      uVar85 = (ulong)uVar84;
      local_649 = uVar84 != 0;
      context = local_638;
      ray = local_640;
      pre = local_618;
    } while (local_649);
  }
  return local_649;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }